

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::BSplineCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Primitive PVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined3 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [16];
  byte bVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  RTCFilterFunctionN p_Var58;
  int iVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  bool bVar64;
  uint uVar65;
  uint uVar66;
  int iVar67;
  uint uVar68;
  uint uVar69;
  short sVar70;
  float t1;
  undefined2 uVar99;
  float fVar71;
  float fVar100;
  float fVar101;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar102;
  float fVar121;
  float fVar122;
  undefined1 auVar103 [16];
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar123;
  float fVar140;
  float fVar141;
  vfloat4 v;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar142;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar144;
  float fVar160;
  float fVar162;
  vfloat4 v_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  float fVar161;
  float fVar163;
  float fVar164;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  float fVar165;
  float fVar168;
  float fVar169;
  vfloat4 a;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar174;
  float fVar197;
  float fVar198;
  vfloat_impl<4> p00;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  float fVar209;
  float fVar210;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar211;
  float fVar212;
  float fVar221;
  float fVar223;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  float fVar222;
  float fVar224;
  float fVar225;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar226;
  float fVar236;
  float fVar237;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar251;
  float fVar254;
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  float fVar252;
  float fVar253;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar271;
  float fVar275;
  vfloat4 a_1;
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar282;
  float fVar291;
  float fVar292;
  vfloat4 a_3;
  float fVar294;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar287 [16];
  float fVar293;
  float fVar295;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar296;
  float fVar297;
  float fVar306;
  float fVar308;
  float fVar310;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar302 [16];
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar312;
  float fVar313;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_43d;
  uint local_43c;
  undefined8 local_438;
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  undefined4 local_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  ulong local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  ulong local_300;
  Primitive *local_2f8;
  long local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint auStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 uVar98;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar158 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  
  PVar10 = prim[1];
  uVar54 = (ulong)(byte)PVar10;
  lVar17 = uVar54 * 0x25;
  pPVar4 = prim + lVar17 + 6;
  fVar141 = *(float *)(pPVar4 + 0xc);
  fVar143 = ((ray->org).field_0.m128[0] - *(float *)pPVar4) * fVar141;
  fVar160 = ((ray->org).field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar141;
  fVar162 = ((ray->org).field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar141;
  fVar123 = fVar141 * (ray->dir).field_0.m128[0];
  fVar140 = fVar141 * (ray->dir).field_0.m128[1];
  fVar141 = fVar141 * (ray->dir).field_0.m128[2];
  uVar11 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar60;
  auVar116._12_2_ = uVar99;
  auVar116._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar125._12_4_ = auVar116._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar60;
  auVar125._10_2_ = uVar99;
  auVar72._10_6_ = auVar125._10_6_;
  auVar72._8_2_ = uVar99;
  auVar72._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar31._4_8_ = auVar72._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  fVar312 = (float)((int)sVar70 >> 8);
  fVar317 = (float)(auVar31._0_4_ >> 0x18);
  fVar318 = (float)(auVar72._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar105._8_4_ = 0;
  auVar105._0_8_ = uVar60;
  auVar105._12_2_ = uVar99;
  auVar105._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar104._12_4_ = auVar105._12_4_;
  auVar104._8_2_ = 0;
  auVar104._0_8_ = uVar60;
  auVar104._10_2_ = uVar99;
  auVar103._10_6_ = auVar104._10_6_;
  auVar103._8_2_ = uVar99;
  auVar103._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar32._4_8_ = auVar103._8_8_;
  auVar32._2_2_ = uVar99;
  auVar32._0_2_ = uVar99;
  fVar165 = (float)((int)sVar70 >> 8);
  fVar168 = (float)(auVar32._0_4_ >> 0x18);
  fVar169 = (float)(auVar103._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar108._8_4_ = 0;
  auVar108._0_8_ = uVar60;
  auVar108._12_2_ = uVar99;
  auVar108._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._8_2_ = 0;
  auVar107._0_8_ = uVar60;
  auVar107._10_2_ = uVar99;
  auVar106._10_6_ = auVar107._10_6_;
  auVar106._8_2_ = uVar99;
  auVar106._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar33._4_8_ = auVar106._8_8_;
  auVar33._2_2_ = uVar99;
  auVar33._0_2_ = uVar99;
  fVar199 = (float)((int)sVar70 >> 8);
  fVar209 = (float)(auVar33._0_4_ >> 0x18);
  fVar210 = (float)(auVar106._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar60;
  auVar111._12_2_ = uVar99;
  auVar111._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar60;
  auVar110._10_2_ = uVar99;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar99;
  auVar109._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar34._4_8_ = auVar109._8_8_;
  auVar34._2_2_ = uVar99;
  auVar34._0_2_ = uVar99;
  fVar71 = (float)((int)sVar70 >> 8);
  fVar100 = (float)(auVar34._0_4_ >> 0x18);
  fVar101 = (float)(auVar109._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar60;
  auVar177._12_2_ = uVar99;
  auVar177._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar60;
  auVar176._10_2_ = uVar99;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar99;
  auVar175._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar35._4_8_ = auVar175._8_8_;
  auVar35._2_2_ = uVar99;
  auVar35._0_2_ = uVar99;
  fVar211 = (float)((int)sVar70 >> 8);
  fVar221 = (float)(auVar35._0_4_ >> 0x18);
  fVar223 = (float)(auVar175._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar54 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar60;
  auVar180._12_2_ = uVar99;
  auVar180._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar60;
  auVar179._10_2_ = uVar99;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar99;
  auVar178._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar36._4_8_ = auVar178._8_8_;
  auVar36._2_2_ = uVar99;
  auVar36._0_2_ = uVar99;
  fVar238 = (float)((int)sVar70 >> 8);
  fVar251 = (float)(auVar36._0_4_ >> 0x18);
  fVar254 = (float)(auVar178._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar60;
  auVar183._12_2_ = uVar99;
  auVar183._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar60;
  auVar182._10_2_ = uVar99;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar99;
  auVar181._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar37._4_8_ = auVar181._8_8_;
  auVar37._2_2_ = uVar99;
  auVar37._0_2_ = uVar99;
  fVar226 = (float)((int)sVar70 >> 8);
  fVar236 = (float)(auVar37._0_4_ >> 0x18);
  fVar237 = (float)(auVar181._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar60;
  auVar186._12_2_ = uVar99;
  auVar186._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar60;
  auVar185._10_2_ = uVar99;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar99;
  auVar184._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar38._4_8_ = auVar184._8_8_;
  auVar38._2_2_ = uVar99;
  auVar38._0_2_ = uVar99;
  fVar259 = (float)((int)sVar70 >> 8);
  fVar271 = (float)(auVar38._0_4_ >> 0x18);
  fVar275 = (float)(auVar184._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar60;
  auVar189._12_2_ = uVar99;
  auVar189._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar60;
  auVar188._10_2_ = uVar99;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar99;
  auVar187._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar39._4_8_ = auVar187._8_8_;
  auVar39._2_2_ = uVar99;
  auVar39._0_2_ = uVar99;
  fVar102 = (float)((int)sVar70 >> 8);
  fVar121 = (float)(auVar39._0_4_ >> 0x18);
  fVar122 = (float)(auVar187._8_4_ >> 0x18);
  fVar296 = fVar123 * fVar312 + fVar140 * fVar165 + fVar141 * fVar199;
  fVar306 = fVar123 * fVar317 + fVar140 * fVar168 + fVar141 * fVar209;
  fVar308 = fVar123 * fVar318 + fVar140 * fVar169 + fVar141 * fVar210;
  fVar310 = fVar123 * (float)(auVar125._12_4_ >> 0x18) +
            fVar140 * (float)(auVar104._12_4_ >> 0x18) + fVar141 * (float)(auVar107._12_4_ >> 0x18);
  fVar282 = fVar123 * fVar71 + fVar140 * fVar211 + fVar141 * fVar238;
  fVar291 = fVar123 * fVar100 + fVar140 * fVar221 + fVar141 * fVar251;
  fVar292 = fVar123 * fVar101 + fVar140 * fVar223 + fVar141 * fVar254;
  fVar294 = fVar123 * (float)(auVar110._12_4_ >> 0x18) +
            fVar140 * (float)(auVar176._12_4_ >> 0x18) + fVar141 * (float)(auVar179._12_4_ >> 0x18);
  fVar174 = fVar123 * fVar226 + fVar140 * fVar259 + fVar141 * fVar102;
  fVar197 = fVar123 * fVar236 + fVar140 * fVar271 + fVar141 * fVar121;
  fVar198 = fVar123 * fVar237 + fVar140 * fVar275 + fVar141 * fVar122;
  fVar123 = fVar123 * (float)(auVar182._12_4_ >> 0x18) +
            fVar140 * (float)(auVar185._12_4_ >> 0x18) + fVar141 * (float)(auVar188._12_4_ >> 0x18);
  fVar313 = fVar312 * fVar143 + fVar165 * fVar160 + fVar199 * fVar162;
  fVar317 = fVar317 * fVar143 + fVar168 * fVar160 + fVar209 * fVar162;
  fVar318 = fVar318 * fVar143 + fVar169 * fVar160 + fVar210 * fVar162;
  fVar319 = (float)(auVar125._12_4_ >> 0x18) * fVar143 +
            (float)(auVar104._12_4_ >> 0x18) * fVar160 + (float)(auVar107._12_4_ >> 0x18) * fVar162;
  fVar238 = fVar71 * fVar143 + fVar211 * fVar160 + fVar238 * fVar162;
  fVar251 = fVar100 * fVar143 + fVar221 * fVar160 + fVar251 * fVar162;
  fVar254 = fVar101 * fVar143 + fVar223 * fVar160 + fVar254 * fVar162;
  fVar312 = (float)(auVar110._12_4_ >> 0x18) * fVar143 +
            (float)(auVar176._12_4_ >> 0x18) * fVar160 + (float)(auVar179._12_4_ >> 0x18) * fVar162;
  fVar226 = fVar143 * fVar226 + fVar160 * fVar259 + fVar162 * fVar102;
  fVar236 = fVar143 * fVar236 + fVar160 * fVar271 + fVar162 * fVar121;
  fVar237 = fVar143 * fVar237 + fVar160 * fVar275 + fVar162 * fVar122;
  fVar259 = fVar143 * (float)(auVar182._12_4_ >> 0x18) +
            fVar160 * (float)(auVar185._12_4_ >> 0x18) + fVar162 * (float)(auVar188._12_4_ >> 0x18);
  fVar141 = (float)DAT_01ff1d40;
  fVar71 = DAT_01ff1d40._4_4_;
  fVar100 = DAT_01ff1d40._8_4_;
  fVar101 = DAT_01ff1d40._12_4_;
  uVar65 = -(uint)(fVar141 <= ABS(fVar296));
  uVar66 = -(uint)(fVar71 <= ABS(fVar306));
  uVar68 = -(uint)(fVar100 <= ABS(fVar308));
  uVar69 = -(uint)(fVar101 <= ABS(fVar310));
  auVar298._0_4_ = (uint)fVar296 & uVar65;
  auVar298._4_4_ = (uint)fVar306 & uVar66;
  auVar298._8_4_ = (uint)fVar308 & uVar68;
  auVar298._12_4_ = (uint)fVar310 & uVar69;
  auVar145._0_4_ = ~uVar65 & (uint)fVar141;
  auVar145._4_4_ = ~uVar66 & (uint)fVar71;
  auVar145._8_4_ = ~uVar68 & (uint)fVar100;
  auVar145._12_4_ = ~uVar69 & (uint)fVar101;
  auVar145 = auVar145 | auVar298;
  uVar65 = -(uint)(fVar141 <= ABS(fVar282));
  uVar66 = -(uint)(fVar71 <= ABS(fVar291));
  uVar68 = -(uint)(fVar100 <= ABS(fVar292));
  uVar69 = -(uint)(fVar101 <= ABS(fVar294));
  auVar283._0_4_ = (uint)fVar282 & uVar65;
  auVar283._4_4_ = (uint)fVar291 & uVar66;
  auVar283._8_4_ = (uint)fVar292 & uVar68;
  auVar283._12_4_ = (uint)fVar294 & uVar69;
  auVar200._0_4_ = ~uVar65 & (uint)fVar141;
  auVar200._4_4_ = ~uVar66 & (uint)fVar71;
  auVar200._8_4_ = ~uVar68 & (uint)fVar100;
  auVar200._12_4_ = ~uVar69 & (uint)fVar101;
  auVar200 = auVar200 | auVar283;
  uVar65 = -(uint)(fVar141 <= ABS(fVar174));
  uVar66 = -(uint)(fVar71 <= ABS(fVar197));
  uVar68 = -(uint)(fVar100 <= ABS(fVar198));
  uVar69 = -(uint)(fVar101 <= ABS(fVar123));
  auVar190._0_4_ = (uint)fVar174 & uVar65;
  auVar190._4_4_ = (uint)fVar197 & uVar66;
  auVar190._8_4_ = (uint)fVar198 & uVar68;
  auVar190._12_4_ = (uint)fVar123 & uVar69;
  auVar213._0_4_ = ~uVar65 & (uint)fVar141;
  auVar213._4_4_ = ~uVar66 & (uint)fVar71;
  auVar213._8_4_ = ~uVar68 & (uint)fVar100;
  auVar213._12_4_ = ~uVar69 & (uint)fVar101;
  auVar213 = auVar213 | auVar190;
  auVar72 = rcpps(_DAT_01ff1d40,auVar145);
  fVar141 = auVar72._0_4_;
  fVar101 = auVar72._4_4_;
  fVar165 = auVar72._8_4_;
  fVar211 = auVar72._12_4_;
  fVar141 = (1.0 - auVar145._0_4_ * fVar141) * fVar141 + fVar141;
  fVar101 = (1.0 - auVar145._4_4_ * fVar101) * fVar101 + fVar101;
  fVar165 = (1.0 - auVar145._8_4_ * fVar165) * fVar165 + fVar165;
  fVar211 = (1.0 - auVar145._12_4_ * fVar211) * fVar211 + fVar211;
  auVar72 = rcpps(auVar72,auVar200);
  fVar71 = auVar72._0_4_;
  fVar102 = auVar72._4_4_;
  fVar168 = auVar72._8_4_;
  fVar221 = auVar72._12_4_;
  fVar71 = (1.0 - auVar200._0_4_ * fVar71) * fVar71 + fVar71;
  fVar102 = (1.0 - auVar200._4_4_ * fVar102) * fVar102 + fVar102;
  fVar168 = (1.0 - auVar200._8_4_ * fVar168) * fVar168 + fVar168;
  fVar221 = (1.0 - auVar200._12_4_ * fVar221) * fVar221 + fVar221;
  auVar72 = rcpps(auVar72,auVar213);
  fVar100 = auVar72._0_4_;
  fVar121 = auVar72._4_4_;
  fVar169 = auVar72._8_4_;
  fVar223 = auVar72._12_4_;
  fVar100 = (1.0 - auVar213._0_4_ * fVar100) * fVar100 + fVar100;
  fVar121 = (1.0 - auVar213._4_4_ * fVar121) * fVar121 + fVar121;
  fVar169 = (1.0 - auVar213._8_4_ * fVar169) * fVar169 + fVar169;
  fVar223 = (1.0 - auVar213._12_4_ * fVar223) * fVar223 + fVar223;
  fVar271 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar17 + 0x16)) *
            *(float *)(prim + lVar17 + 0x1a);
  uVar60 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar99 = (undefined2)(uVar60 >> 0x30);
  auVar127._8_4_ = 0;
  auVar127._0_8_ = uVar60;
  auVar127._12_2_ = uVar99;
  auVar127._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar60 >> 0x20);
  auVar321._12_4_ = auVar127._12_4_;
  auVar321._8_2_ = 0;
  auVar321._0_8_ = uVar60;
  auVar321._10_2_ = uVar99;
  auVar73._10_6_ = auVar321._10_6_;
  auVar73._8_2_ = uVar99;
  auVar73._0_8_ = uVar60;
  uVar99 = (undefined2)(uVar60 >> 0x10);
  auVar40._4_8_ = auVar73._8_8_;
  auVar40._2_2_ = uVar99;
  auVar40._0_2_ = uVar99;
  fVar122 = (float)(auVar40._0_4_ >> 0x10);
  fVar174 = (float)(auVar73._8_4_ >> 0x10);
  uVar55 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar99 = (undefined2)(uVar55 >> 0x30);
  auVar148._8_4_ = 0;
  auVar148._0_8_ = uVar55;
  auVar148._12_2_ = uVar99;
  auVar148._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar55 >> 0x20);
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._8_2_ = 0;
  auVar147._0_8_ = uVar55;
  auVar147._10_2_ = uVar99;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._8_2_ = uVar99;
  auVar146._0_8_ = uVar55;
  uVar99 = (undefined2)(uVar55 >> 0x10);
  auVar41._4_8_ = auVar146._8_8_;
  auVar41._2_2_ = uVar99;
  auVar41._0_2_ = uVar99;
  uVar56 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar99 = (undefined2)(uVar56 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar56;
  auVar76._12_2_ = uVar99;
  auVar76._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar56 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar56;
  auVar75._10_2_ = uVar99;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar99;
  auVar74._0_8_ = uVar56;
  uVar99 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar74._8_8_;
  auVar42._2_2_ = uVar99;
  auVar42._0_2_ = uVar99;
  fVar123 = (float)(auVar42._0_4_ >> 0x10);
  fVar197 = (float)(auVar74._8_4_ >> 0x10);
  uVar57 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar99 = (undefined2)(uVar57 >> 0x30);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar57;
  auVar216._12_2_ = uVar99;
  auVar216._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar57 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar57;
  auVar215._10_2_ = uVar99;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar99;
  auVar214._0_8_ = uVar57;
  uVar99 = (undefined2)(uVar57 >> 0x10);
  auVar43._4_8_ = auVar214._8_8_;
  auVar43._2_2_ = uVar99;
  auVar43._0_2_ = uVar99;
  uVar61 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar99 = (undefined2)(uVar61 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar61;
  auVar79._12_2_ = uVar99;
  auVar79._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar61 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar61;
  auVar78._10_2_ = uVar99;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar99;
  auVar77._0_8_ = uVar61;
  uVar99 = (undefined2)(uVar61 >> 0x10);
  auVar44._4_8_ = auVar77._8_8_;
  auVar44._2_2_ = uVar99;
  auVar44._0_2_ = uVar99;
  fVar140 = (float)(auVar44._0_4_ >> 0x10);
  fVar198 = (float)(auVar77._8_4_ >> 0x10);
  uVar62 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar5 = *(ulong *)(prim + uVar54 * 2 + uVar62 + 6);
  uVar99 = (undefined2)(uVar5 >> 0x30);
  auVar243._8_4_ = 0;
  auVar243._0_8_ = uVar5;
  auVar243._12_2_ = uVar99;
  auVar243._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar5 >> 0x20);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._8_2_ = 0;
  auVar242._0_8_ = uVar5;
  auVar242._10_2_ = uVar99;
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = uVar99;
  auVar241._0_8_ = uVar5;
  uVar99 = (undefined2)(uVar5 >> 0x10);
  auVar45._4_8_ = auVar241._8_8_;
  auVar45._2_2_ = uVar99;
  auVar45._0_2_ = uVar99;
  uVar62 = *(ulong *)(prim + uVar62 + 6);
  uVar99 = (undefined2)(uVar62 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar62;
  auVar82._12_2_ = uVar99;
  auVar82._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar62 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar62;
  auVar81._10_2_ = uVar99;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar99;
  auVar80._0_8_ = uVar62;
  uVar99 = (undefined2)(uVar62 >> 0x10);
  auVar46._4_8_ = auVar80._8_8_;
  auVar46._2_2_ = uVar99;
  auVar46._0_2_ = uVar99;
  fVar143 = (float)(auVar46._0_4_ >> 0x10);
  fVar199 = (float)(auVar80._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar99 = (undefined2)(uVar6 >> 0x30);
  auVar265._8_4_ = 0;
  auVar265._0_8_ = uVar6;
  auVar265._12_2_ = uVar99;
  auVar265._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar6 >> 0x20);
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar6;
  auVar264._10_2_ = uVar99;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._8_2_ = uVar99;
  auVar263._0_8_ = uVar6;
  uVar99 = (undefined2)(uVar6 >> 0x10);
  auVar47._4_8_ = auVar263._8_8_;
  auVar47._2_2_ = uVar99;
  auVar47._0_2_ = uVar99;
  uVar7 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar99 = (undefined2)(uVar7 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar7;
  auVar85._12_2_ = uVar99;
  auVar85._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar7 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar7;
  auVar84._10_2_ = uVar99;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar99;
  auVar83._0_8_ = uVar7;
  uVar99 = (undefined2)(uVar7 >> 0x10);
  auVar48._4_8_ = auVar83._8_8_;
  auVar48._2_2_ = uVar99;
  auVar48._0_2_ = uVar99;
  fVar160 = (float)(auVar48._0_4_ >> 0x10);
  fVar209 = (float)(auVar83._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar10 * 0x20 + 6);
  uVar99 = (undefined2)(uVar8 >> 0x30);
  auVar286._8_4_ = 0;
  auVar286._0_8_ = uVar8;
  auVar286._12_2_ = uVar99;
  auVar286._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar8 >> 0x20);
  auVar285._12_4_ = auVar286._12_4_;
  auVar285._8_2_ = 0;
  auVar285._0_8_ = uVar8;
  auVar285._10_2_ = uVar99;
  auVar284._10_6_ = auVar285._10_6_;
  auVar284._8_2_ = uVar99;
  auVar284._0_8_ = uVar8;
  uVar99 = (undefined2)(uVar8 >> 0x10);
  auVar49._4_8_ = auVar284._8_8_;
  auVar49._2_2_ = uVar99;
  auVar49._0_2_ = uVar99;
  uVar9 = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar54) + 6);
  uVar99 = (undefined2)(uVar9 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar9;
  auVar88._12_2_ = uVar99;
  auVar88._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar9 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar9;
  auVar87._10_2_ = uVar99;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar99;
  auVar86._0_8_ = uVar9;
  uVar99 = (undefined2)(uVar9 >> 0x10);
  auVar50._4_8_ = auVar86._8_8_;
  auVar50._2_2_ = uVar99;
  auVar50._0_2_ = uVar99;
  fVar162 = (float)(auVar50._0_4_ >> 0x10);
  fVar210 = (float)(auVar86._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar301._8_4_ = 0;
  auVar301._0_8_ = uVar54;
  auVar301._12_2_ = uVar99;
  auVar301._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar300._12_4_ = auVar301._12_4_;
  auVar300._8_2_ = 0;
  auVar300._0_8_ = uVar54;
  auVar300._10_2_ = uVar99;
  auVar299._10_6_ = auVar300._10_6_;
  auVar299._8_2_ = uVar99;
  auVar299._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar51._4_8_ = auVar299._8_8_;
  auVar51._2_2_ = uVar99;
  auVar51._0_2_ = uVar99;
  auVar149._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar122) * fVar271 + fVar122) - fVar317) *
                fVar101,((((float)(int)(short)uVar55 - (float)(int)(short)uVar60) * fVar271 +
                         (float)(int)(short)uVar60) - fVar313) * fVar141);
  auVar149._8_4_ =
       ((((float)(auVar146._8_4_ >> 0x10) - fVar174) * fVar271 + fVar174) - fVar318) * fVar165;
  auVar149._12_4_ =
       ((((float)(auVar147._12_4_ >> 0x10) - (float)(auVar321._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar321._12_4_ >> 0x10)) - fVar319) * fVar211;
  auVar217._0_4_ =
       ((((float)(int)(short)uVar57 - (float)(int)(short)uVar56) * fVar271 +
        (float)(int)(short)uVar56) - fVar313) * fVar141;
  auVar217._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar123) * fVar271 + fVar123) - fVar317) * fVar101;
  auVar217._8_4_ =
       ((((float)(auVar214._8_4_ >> 0x10) - fVar197) * fVar271 + fVar197) - fVar318) * fVar165;
  auVar217._12_4_ =
       ((((float)(auVar215._12_4_ >> 0x10) - (float)(auVar75._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar75._12_4_ >> 0x10)) - fVar319) * fVar211;
  auVar244._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar140) * fVar271 + fVar140) - fVar251) *
                fVar102,((((float)(int)(short)uVar5 - (float)(int)(short)uVar61) * fVar271 +
                         (float)(int)(short)uVar61) - fVar238) * fVar71);
  auVar244._8_4_ =
       ((((float)(auVar241._8_4_ >> 0x10) - fVar198) * fVar271 + fVar198) - fVar254) * fVar168;
  auVar244._12_4_ =
       ((((float)(auVar242._12_4_ >> 0x10) - (float)(auVar78._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar78._12_4_ >> 0x10)) - fVar312) * fVar221;
  auVar266._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar62) * fVar271 +
        (float)(int)(short)uVar62) - fVar238) * fVar71;
  auVar266._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar143) * fVar271 + fVar143) - fVar251) * fVar102;
  auVar266._8_4_ =
       ((((float)(auVar263._8_4_ >> 0x10) - fVar199) * fVar271 + fVar199) - fVar254) * fVar168;
  auVar266._12_4_ =
       ((((float)(auVar264._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar312) * fVar221;
  auVar287._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar160) * fVar271 + fVar160) - fVar236) *
                fVar121,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar271 +
                         (float)(int)(short)uVar7) - fVar226) * fVar100);
  auVar287._8_4_ =
       ((((float)(auVar284._8_4_ >> 0x10) - fVar209) * fVar271 + fVar209) - fVar237) * fVar169;
  auVar287._12_4_ =
       ((((float)(auVar285._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar259) * fVar223;
  auVar302._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar9) * fVar271 + (float)(int)(short)uVar9
        ) - fVar226) * fVar100;
  auVar302._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar162) * fVar271 + fVar162) - fVar236) * fVar121;
  auVar302._8_4_ =
       ((((float)(auVar299._8_4_ >> 0x10) - fVar210) * fVar271 + fVar210) - fVar237) * fVar169;
  auVar302._12_4_ =
       ((((float)(auVar300._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar259) * fVar223;
  auVar124._8_4_ = auVar149._8_4_;
  auVar124._0_8_ = auVar149._0_8_;
  auVar124._12_4_ = auVar149._12_4_;
  auVar125 = minps(auVar124,auVar217);
  auVar89._8_4_ = auVar244._8_4_;
  auVar89._0_8_ = auVar244._0_8_;
  auVar89._12_4_ = auVar244._12_4_;
  auVar72 = minps(auVar89,auVar266);
  auVar125 = maxps(auVar125,auVar72);
  auVar90._8_4_ = auVar287._8_4_;
  auVar90._0_8_ = auVar287._0_8_;
  auVar90._12_4_ = auVar287._12_4_;
  auVar72 = minps(auVar90,auVar302);
  uVar11 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar112._4_4_ = uVar11;
  auVar112._0_4_ = uVar11;
  auVar112._8_4_ = uVar11;
  auVar112._12_4_ = uVar11;
  auVar72 = maxps(auVar72,auVar112);
  auVar72 = maxps(auVar125,auVar72);
  local_178 = auVar72._0_4_ * 0.99999964;
  fStack_174 = auVar72._4_4_ * 0.99999964;
  fStack_170 = auVar72._8_4_ * 0.99999964;
  fStack_16c = auVar72._12_4_ * 0.99999964;
  auVar72 = maxps(auVar149,auVar217);
  auVar125 = maxps(auVar244,auVar266);
  auVar72 = minps(auVar72,auVar125);
  auVar125 = maxps(auVar287,auVar302);
  fVar141 = ray->tfar;
  auVar91._4_4_ = fVar141;
  auVar91._0_4_ = fVar141;
  auVar91._8_4_ = fVar141;
  auVar91._12_4_ = fVar141;
  auVar125 = minps(auVar125,auVar91);
  auVar72 = minps(auVar72,auVar125);
  uVar65 = (uint)(byte)PVar10;
  auVar113._0_4_ = -(uint)(uVar65 != 0 && local_178 <= auVar72._0_4_ * 1.0000004);
  auVar113._4_4_ = -(uint)(1 < uVar65 && fStack_174 <= auVar72._4_4_ * 1.0000004);
  auVar113._8_4_ = -(uint)(2 < uVar65 && fStack_170 <= auVar72._8_4_ * 1.0000004);
  auVar113._12_4_ = -(uint)(3 < uVar65 && fStack_16c <= auVar72._12_4_ * 1.0000004);
  uVar65 = movmskps(uVar65,auVar113);
  local_43d = uVar65 != 0;
  if (uVar65 == 0) {
    return local_43d;
  }
  uVar65 = uVar65 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_2f8 = prim;
LAB_00bf1a11:
  lVar17 = 0;
  if ((ulong)uVar65 != 0) {
    for (; (uVar65 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
    }
  }
  local_360 = (ulong)*(uint *)(local_2f8 + 2);
  uVar66 = *(uint *)(local_2f8 + lVar17 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[local_360].ptr;
  fVar141 = pGVar12->fnumTimeSegments;
  fVar71 = (pGVar12->time_range).lower;
  fVar100 = (((ray->dir).field_0.m128[3] - fVar71) / ((pGVar12->time_range).upper - fVar71)) *
            fVar141;
  fVar71 = floorf(fVar100);
  fVar141 = fVar141 + -1.0;
  if (fVar141 <= fVar71) {
    fVar71 = fVar141;
  }
  fVar141 = 0.0;
  if (0.0 <= fVar71) {
    fVar141 = fVar71;
  }
  fVar100 = fVar100 - fVar141;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)uVar66 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar63 = (long)(int)fVar141 * 0x38;
  lVar14 = *(long *)(_Var13 + lVar63);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar63);
  pfVar3 = (float *)(lVar14 + lVar15 * uVar55);
  fVar141 = *pfVar3;
  fVar71 = pfVar3[1];
  fVar101 = pfVar3[2];
  fVar102 = pfVar3[3];
  lVar17 = uVar55 + 1;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar17);
  fVar121 = *pfVar3;
  fVar122 = pfVar3[1];
  fVar123 = pfVar3[2];
  fVar140 = pfVar3[3];
  lVar1 = uVar55 + 2;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar1);
  fVar143 = *pfVar3;
  fVar160 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar165 = pfVar3[3];
  lVar2 = uVar55 + 3;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar2);
  fVar168 = *pfVar3;
  fVar169 = pfVar3[1];
  fVar174 = pfVar3[2];
  fVar197 = pfVar3[3];
  lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar15 = *(long *)(lVar14 + lVar63);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar63);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar55);
  fVar198 = *pfVar3;
  fVar199 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar17);
  fVar211 = *pfVar3;
  fVar221 = pfVar3[1];
  fVar223 = pfVar3[2];
  fVar238 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  fVar251 = *pfVar3;
  fVar254 = pfVar3[1];
  fVar312 = pfVar3[2];
  fVar226 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar2);
  fVar236 = *pfVar3;
  fVar237 = pfVar3[1];
  fVar259 = pfVar3[2];
  fVar271 = pfVar3[3];
  fVar275 = fVar141 * 0.16666667 + fVar121 * 0.6666667 + fVar143 * 0.16666667 + fVar168 * 0.0;
  fVar282 = fVar71 * 0.16666667 + fVar122 * 0.6666667 + fVar160 * 0.16666667 + fVar169 * 0.0;
  fVar291 = fVar101 * 0.16666667 + fVar123 * 0.6666667 + fVar162 * 0.16666667 + fVar174 * 0.0;
  fVar292 = fVar102 * 0.16666667 + fVar140 * 0.6666667 + fVar165 * 0.16666667 + fVar197 * 0.0;
  fVar310 = ((fVar143 * 0.5 + fVar168 * 0.0) - fVar121 * 0.0) - fVar141 * 0.5;
  fVar317 = ((fVar160 * 0.5 + fVar169 * 0.0) - fVar122 * 0.0) - fVar71 * 0.5;
  fVar319 = ((fVar162 * 0.5 + fVar174 * 0.0) - fVar123 * 0.0) - fVar101 * 0.5;
  fVar142 = ((fVar165 * 0.5 + fVar197 * 0.0) - fVar140 * 0.0) - fVar102 * 0.5;
  fVar297 = fVar198 * 0.16666667 + fVar211 * 0.6666667 + fVar251 * 0.16666667 + fVar236 * 0.0;
  fVar307 = fVar199 * 0.16666667 + fVar221 * 0.6666667 + fVar254 * 0.16666667 + fVar237 * 0.0;
  fVar309 = fVar209 * 0.16666667 + fVar223 * 0.6666667 + fVar312 * 0.16666667 + fVar259 * 0.0;
  fVar311 = fVar210 * 0.16666667 + fVar238 * 0.6666667 + fVar226 * 0.16666667 + fVar271 * 0.0;
  fVar313 = ((fVar251 * 0.5 + fVar236 * 0.0) - fVar211 * 0.0) - fVar198 * 0.5;
  fVar318 = ((fVar254 * 0.5 + fVar237 * 0.0) - fVar221 * 0.0) - fVar199 * 0.5;
  fVar293 = ((fVar312 * 0.5 + fVar259 * 0.0) - fVar223 * 0.0) - fVar209 * 0.5;
  fVar295 = ((fVar226 * 0.5 + fVar271 * 0.0) - fVar238 * 0.0) - fVar210 * 0.5;
  fVar144 = fVar121 * 0.16666667 + fVar143 * 0.6666667 + fVar168 * 0.16666667 + fVar141 * 0.0;
  fVar161 = fVar122 * 0.16666667 + fVar160 * 0.6666667 + fVar169 * 0.16666667 + fVar71 * 0.0;
  fVar163 = fVar123 * 0.16666667 + fVar162 * 0.6666667 + fVar174 * 0.16666667 + fVar101 * 0.0;
  fVar164 = fVar140 * 0.16666667 + fVar165 * 0.6666667 + fVar197 * 0.16666667 + fVar102 * 0.0;
  fVar294 = ((fVar143 * 0.0 + fVar168 * 0.5) - fVar121 * 0.5) - fVar141 * 0.0;
  fVar296 = ((fVar160 * 0.0 + fVar169 * 0.5) - fVar122 * 0.5) - fVar71 * 0.0;
  fVar306 = ((fVar162 * 0.0 + fVar174 * 0.5) - fVar123 * 0.5) - fVar101 * 0.0;
  fVar308 = ((fVar165 * 0.0 + fVar197 * 0.5) - fVar140 * 0.5) - fVar102 * 0.0;
  fVar121 = fVar211 * 0.16666667 + fVar251 * 0.6666667 + fVar236 * 0.16666667 + fVar198 * 0.0;
  fVar122 = fVar221 * 0.16666667 + fVar254 * 0.6666667 + fVar237 * 0.16666667 + fVar199 * 0.0;
  fVar123 = fVar223 * 0.16666667 + fVar312 * 0.6666667 + fVar259 * 0.16666667 + fVar209 * 0.0;
  fVar143 = fVar238 * 0.16666667 + fVar226 * 0.6666667 + fVar271 * 0.16666667 + fVar210 * 0.0;
  fVar141 = ((fVar251 * 0.0 + fVar236 * 0.5) - fVar211 * 0.5) - fVar198 * 0.0;
  fVar71 = ((fVar254 * 0.0 + fVar237 * 0.5) - fVar221 * 0.5) - fVar199 * 0.0;
  fVar101 = ((fVar312 * 0.0 + fVar259 * 0.5) - fVar223 * 0.5) - fVar209 * 0.0;
  fVar102 = ((fVar226 * 0.0 + fVar271 * 0.5) - fVar238 * 0.5) - fVar210 * 0.0;
  fVar211 = fVar317 * fVar297 - fVar307 * fVar310;
  fVar223 = fVar319 * fVar307 - fVar309 * fVar317;
  fVar238 = fVar310 * fVar309 - fVar297 * fVar319;
  fVar251 = fVar142 * fVar311 - fVar311 * fVar142;
  fVar168 = fVar317 * fVar313 - fVar318 * fVar310;
  fVar174 = fVar319 * fVar318 - fVar293 * fVar317;
  fVar197 = fVar310 * fVar293 - fVar313 * fVar319;
  fVar140 = fVar296 * fVar121 - fVar122 * fVar294;
  fVar160 = fVar306 * fVar122 - fVar123 * fVar296;
  fVar162 = fVar294 * fVar123 - fVar121 * fVar306;
  fVar165 = fVar308 * fVar143 - fVar143 * fVar308;
  fVar121 = fVar296 * fVar141 - fVar71 * fVar294;
  fVar122 = fVar306 * fVar71 - fVar101 * fVar296;
  fVar101 = fVar294 * fVar101 - fVar141 * fVar306;
  fVar199 = fVar238 * fVar238 + fVar223 * fVar223 + fVar211 * fVar211;
  auVar125 = ZEXT416((uint)fVar199);
  auVar72 = rsqrtss(ZEXT416((uint)fVar199),auVar125);
  fVar141 = auVar72._0_4_;
  fVar209 = fVar141 * 1.5 - fVar141 * fVar141 * fVar199 * 0.5 * fVar141;
  fVar221 = fVar211 * fVar168 + fVar238 * fVar197 + fVar223 * fVar174;
  fVar141 = fVar251 * fVar209;
  auVar72 = rcpss(auVar125,auVar125);
  fVar169 = (2.0 - fVar199 * auVar72._0_4_) * auVar72._0_4_;
  fVar198 = fVar162 * fVar162 + fVar160 * fVar160 + fVar140 * fVar140;
  auVar72 = ZEXT416((uint)fVar198);
  auVar125 = rsqrtss(ZEXT416((uint)fVar198),auVar72);
  fVar71 = auVar125._0_4_;
  fVar143 = fVar71 * 1.5 - fVar71 * fVar71 * fVar198 * 0.5 * fVar71;
  fVar210 = fVar140 * fVar121 + fVar162 * fVar101 + fVar160 * fVar122;
  fVar123 = fVar165 * fVar143;
  auVar72 = rcpss(auVar72,auVar72);
  fVar71 = (2.0 - fVar198 * auVar72._0_4_) * auVar72._0_4_;
  fVar212 = fVar292 * fVar223 * fVar209;
  fVar222 = fVar292 * fVar238 * fVar209;
  fVar224 = fVar292 * fVar211 * fVar209;
  fVar225 = fVar292 * fVar141;
  fVar260 = fVar275 - fVar212;
  fVar272 = fVar282 - fVar222;
  fVar276 = fVar291 - fVar224;
  fVar279 = fVar292 - fVar225;
  fVar239 = fVar292 * fVar169 * (fVar199 * fVar174 - fVar221 * fVar223) * fVar209 +
            fVar142 * fVar223 * fVar209;
  fVar252 = fVar292 * fVar169 * (fVar199 * fVar197 - fVar221 * fVar238) * fVar209 +
            fVar142 * fVar238 * fVar209;
  fVar255 = fVar292 * fVar169 * (fVar199 * fVar168 - fVar221 * fVar211) * fVar209 +
            fVar142 * fVar211 * fVar209;
  fVar257 = fVar292 * fVar169 * (fVar199 * (fVar142 * fVar295 - fVar295 * fVar142) -
                                fVar221 * fVar251) * fVar209 + fVar142 * fVar141;
  fVar212 = fVar212 + fVar275;
  fVar222 = fVar222 + fVar282;
  fVar224 = fVar224 + fVar291;
  fVar225 = fVar225 + fVar292;
  fVar275 = fVar164 * fVar160 * fVar143;
  fVar282 = fVar164 * fVar162 * fVar143;
  fVar291 = fVar164 * fVar140 * fVar143;
  fVar292 = fVar164 * fVar123;
  fVar297 = fVar144 - fVar275;
  fVar309 = fVar161 - fVar282;
  fVar170 = fVar163 - fVar291;
  fVar172 = fVar164 - fVar292;
  fVar313 = fVar164 * fVar71 * (fVar198 * fVar122 - fVar210 * fVar160) * fVar143 +
            fVar308 * fVar160 * fVar143;
  fVar318 = fVar164 * fVar71 * (fVar198 * fVar101 - fVar210 * fVar162) * fVar143 +
            fVar308 * fVar162 * fVar143;
  fVar293 = fVar164 * fVar71 * (fVar198 * fVar121 - fVar210 * fVar140) * fVar143 +
            fVar308 * fVar140 * fVar143;
  fVar295 = fVar164 * fVar71 * (fVar198 * (fVar308 * fVar102 - fVar102 * fVar308) -
                               fVar210 * fVar165) * fVar143 + fVar308 * fVar123;
  fVar275 = fVar275 + fVar144;
  fVar282 = fVar282 + fVar161;
  fVar291 = fVar291 + fVar163;
  fVar292 = fVar292 + fVar164;
  lVar15 = *(long *)(_Var13 + 0x38 + lVar63);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar63);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar55);
  fVar141 = *pfVar3;
  fVar71 = pfVar3[1];
  fVar101 = pfVar3[2];
  fVar102 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar17);
  fVar121 = *pfVar3;
  fVar122 = pfVar3[1];
  fVar123 = pfVar3[2];
  fVar140 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  fVar143 = *pfVar3;
  fVar160 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar165 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar2);
  fVar168 = *pfVar3;
  fVar169 = pfVar3[1];
  fVar174 = pfVar3[2];
  fVar197 = pfVar3[3];
  lVar15 = *(long *)(lVar14 + 0x38 + lVar63);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar63);
  uVar60 = lVar17 * lVar14;
  fVar261 = fVar141 * 0.16666667 + fVar121 * 0.6666667 + fVar143 * 0.16666667 + fVar168 * 0.0;
  fVar273 = fVar71 * 0.16666667 + fVar122 * 0.6666667 + fVar160 * 0.16666667 + fVar169 * 0.0;
  fVar277 = fVar101 * 0.16666667 + fVar123 * 0.6666667 + fVar162 * 0.16666667 + fVar174 * 0.0;
  fVar280 = fVar102 * 0.16666667 + fVar140 * 0.6666667 + fVar165 * 0.16666667 + fVar197 * 0.0;
  fVar144 = ((fVar143 * 0.5 + fVar168 * 0.0) - fVar121 * 0.0) - fVar141 * 0.5;
  fVar161 = ((fVar160 * 0.5 + fVar169 * 0.0) - fVar122 * 0.0) - fVar71 * 0.5;
  fVar163 = ((fVar162 * 0.5 + fVar174 * 0.0) - fVar123 * 0.0) - fVar101 * 0.5;
  fVar164 = ((fVar165 * 0.5 + fVar197 * 0.0) - fVar140 * 0.0) - fVar102 * 0.5;
  pfVar3 = (float *)(lVar15 + lVar14 * lVar2);
  fVar198 = *pfVar3;
  fVar199 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar1 * lVar14);
  fVar211 = *pfVar3;
  fVar221 = pfVar3[1];
  fVar223 = pfVar3[2];
  fVar238 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + uVar60);
  fVar251 = *pfVar3;
  fVar254 = pfVar3[1];
  fVar312 = pfVar3[2];
  fVar226 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + uVar55 * lVar14);
  fVar236 = *pfVar3;
  fVar237 = pfVar3[1];
  fVar259 = pfVar3[2];
  fVar271 = pfVar3[3];
  fVar262 = fVar236 * 0.16666667 + fVar251 * 0.6666667 + fVar211 * 0.16666667 + fVar198 * 0.0;
  fVar274 = fVar237 * 0.16666667 + fVar254 * 0.6666667 + fVar221 * 0.16666667 + fVar199 * 0.0;
  fVar278 = fVar259 * 0.16666667 + fVar312 * 0.6666667 + fVar223 * 0.16666667 + fVar209 * 0.0;
  fVar281 = fVar271 * 0.16666667 + fVar226 * 0.6666667 + fVar238 * 0.16666667 + fVar210 * 0.0;
  fVar240 = ((fVar211 * 0.5 + fVar198 * 0.0) - fVar251 * 0.0) - fVar236 * 0.5;
  fVar253 = ((fVar221 * 0.5 + fVar199 * 0.0) - fVar254 * 0.0) - fVar237 * 0.5;
  fVar256 = ((fVar223 * 0.5 + fVar209 * 0.0) - fVar312 * 0.0) - fVar259 * 0.5;
  fVar258 = ((fVar238 * 0.5 + fVar210 * 0.0) - fVar226 * 0.0) - fVar271 * 0.5;
  fVar307 = fVar121 * 0.16666667 + fVar143 * 0.6666667 + fVar168 * 0.16666667 + fVar141 * 0.0;
  fVar311 = fVar122 * 0.16666667 + fVar160 * 0.6666667 + fVar169 * 0.16666667 + fVar71 * 0.0;
  fVar171 = fVar123 * 0.16666667 + fVar162 * 0.6666667 + fVar174 * 0.16666667 + fVar101 * 0.0;
  fVar173 = fVar140 * 0.16666667 + fVar165 * 0.6666667 + fVar197 * 0.16666667 + fVar102 * 0.0;
  fVar141 = ((fVar143 * 0.0 + fVar168 * 0.5) - fVar121 * 0.5) - fVar141 * 0.0;
  fVar71 = ((fVar160 * 0.0 + fVar169 * 0.5) - fVar122 * 0.5) - fVar71 * 0.0;
  fVar101 = ((fVar162 * 0.0 + fVar174 * 0.5) - fVar123 * 0.5) - fVar101 * 0.0;
  fVar102 = ((fVar165 * 0.0 + fVar197 * 0.5) - fVar140 * 0.5) - fVar102 * 0.0;
  fVar143 = fVar251 * 0.16666667 + fVar211 * 0.6666667 + fVar198 * 0.16666667 + fVar236 * 0.0;
  fVar160 = fVar254 * 0.16666667 + fVar221 * 0.6666667 + fVar199 * 0.16666667 + fVar237 * 0.0;
  fVar162 = fVar312 * 0.16666667 + fVar223 * 0.6666667 + fVar209 * 0.16666667 + fVar259 * 0.0;
  fVar197 = fVar226 * 0.16666667 + fVar238 * 0.6666667 + fVar210 * 0.16666667 + fVar271 * 0.0;
  fVar121 = ((fVar211 * 0.0 + fVar198 * 0.5) - fVar251 * 0.5) - fVar236 * 0.0;
  fVar122 = ((fVar221 * 0.0 + fVar199 * 0.5) - fVar254 * 0.5) - fVar237 * 0.0;
  fVar123 = ((fVar223 * 0.0 + fVar209 * 0.5) - fVar312 * 0.5) - fVar259 * 0.0;
  fVar165 = ((fVar238 * 0.0 + fVar210 * 0.5) - fVar226 * 0.5) - fVar271 * 0.0;
  fVar174 = fVar161 * fVar262 - fVar274 * fVar144;
  fVar221 = fVar163 * fVar274 - fVar278 * fVar161;
  fVar238 = fVar144 * fVar278 - fVar262 * fVar163;
  fVar254 = fVar164 * fVar281 - fVar281 * fVar164;
  fVar140 = fVar161 * fVar240 - fVar253 * fVar144;
  fVar168 = fVar163 * fVar253 - fVar256 * fVar161;
  fVar169 = fVar144 * fVar256 - fVar240 * fVar163;
  fVar211 = fVar71 * fVar143 - fVar160 * fVar141;
  fVar223 = fVar101 * fVar160 - fVar162 * fVar71;
  fVar251 = fVar141 * fVar162 - fVar143 * fVar101;
  fVar312 = fVar102 * fVar197 - fVar197 * fVar102;
  fVar143 = fVar71 * fVar121 - fVar122 * fVar141;
  fVar160 = fVar101 * fVar122 - fVar123 * fVar71;
  fVar162 = fVar141 * fVar123 - fVar121 * fVar101;
  fVar121 = fVar238 * fVar238 + fVar221 * fVar221 + fVar174 * fVar174;
  auVar72 = ZEXT416((uint)fVar121);
  auVar125 = rsqrtss(ZEXT416((uint)fVar121),auVar72);
  fVar122 = auVar125._0_4_;
  fVar197 = fVar122 * 1.5 - fVar122 * fVar122 * fVar121 * 0.5 * fVar122;
  fVar226 = fVar174 * fVar140 + fVar238 * fVar169 + fVar221 * fVar168;
  auVar72 = rcpss(auVar72,auVar72);
  fVar122 = (2.0 - fVar121 * auVar72._0_4_) * auVar72._0_4_;
  fVar123 = fVar254 * fVar197;
  fVar237 = fVar251 * fVar251 + fVar223 * fVar223 + fVar211 * fVar211;
  auVar72 = ZEXT416((uint)fVar237);
  auVar125 = rsqrtss(ZEXT416((uint)fVar237),auVar72);
  fVar198 = auVar125._0_4_;
  fVar271 = fVar198 * 1.5 - fVar198 * fVar198 * fVar237 * 0.5 * fVar198;
  fVar240 = fVar211 * fVar143 + fVar251 * fVar162 + fVar223 * fVar160;
  auVar72 = rcpss(auVar72,auVar72);
  fVar253 = (2.0 - fVar237 * auVar72._0_4_) * auVar72._0_4_;
  fVar259 = fVar312 * fVar271;
  fVar198 = fVar280 * fVar221 * fVar197;
  fVar199 = fVar280 * fVar238 * fVar197;
  fVar209 = fVar280 * fVar174 * fVar197;
  fVar210 = fVar280 * fVar123;
  fVar168 = fVar280 * fVar122 * (fVar121 * fVar168 - fVar226 * fVar221) * fVar197 +
            fVar164 * fVar221 * fVar197;
  fVar169 = fVar280 * fVar122 * (fVar121 * fVar169 - fVar226 * fVar238) * fVar197 +
            fVar164 * fVar238 * fVar197;
  fVar174 = fVar280 * fVar122 * (fVar121 * fVar140 - fVar226 * fVar174) * fVar197 +
            fVar164 * fVar174 * fVar197;
  fVar197 = fVar280 * fVar122 * (fVar121 * (fVar164 * fVar258 - fVar258 * fVar164) -
                                fVar226 * fVar254) * fVar197 + fVar164 * fVar123;
  fVar221 = fVar261 - fVar198;
  fVar238 = fVar273 - fVar199;
  fVar254 = fVar277 - fVar209;
  fVar226 = fVar280 - fVar210;
  fVar198 = fVar198 + fVar261;
  fVar199 = fVar199 + fVar273;
  fVar209 = fVar209 + fVar277;
  fVar210 = fVar210 + fVar280;
  fVar121 = fVar173 * fVar223 * fVar271;
  fVar122 = fVar173 * fVar251 * fVar271;
  fVar123 = fVar173 * fVar211 * fVar271;
  fVar140 = fVar173 * fVar259;
  fVar223 = fVar173 * fVar253 * (fVar237 * fVar160 - fVar240 * fVar223) * fVar271 +
            fVar102 * fVar223 * fVar271;
  fVar251 = fVar173 * fVar253 * (fVar237 * fVar162 - fVar240 * fVar251) * fVar271 +
            fVar102 * fVar251 * fVar271;
  fVar236 = fVar173 * fVar253 * (fVar237 * fVar143 - fVar240 * fVar211) * fVar271 +
            fVar102 * fVar211 * fVar271;
  fVar312 = fVar173 * fVar253 * (fVar237 * (fVar102 * fVar165 - fVar165 * fVar102) -
                                fVar240 * fVar312) * fVar271 + fVar102 * fVar259;
  fVar143 = fVar307 - fVar121;
  fVar160 = fVar311 - fVar122;
  fVar162 = fVar171 - fVar123;
  fVar165 = fVar173 - fVar140;
  fVar121 = fVar121 + fVar307;
  fVar122 = fVar122 + fVar311;
  fVar123 = fVar123 + fVar171;
  fVar140 = fVar140 + fVar173;
  fVar211 = 1.0 - fVar100;
  local_398 = fVar260 * fVar211 + fVar221 * fVar100;
  fStack_394 = fVar272 * fVar211 + fVar238 * fVar100;
  fStack_390 = fVar276 * fVar211 + fVar254 * fVar100;
  fStack_38c = fVar279 * fVar211 + fVar226 * fVar100;
  local_3a8 = ((fVar310 - fVar239) * 0.33333334 + fVar260) * fVar211 +
              ((fVar144 - fVar168) * 0.33333334 + fVar221) * fVar100;
  fStack_3a4 = ((fVar317 - fVar252) * 0.33333334 + fVar272) * fVar211 +
               ((fVar161 - fVar169) * 0.33333334 + fVar238) * fVar100;
  fStack_3a0 = ((fVar319 - fVar255) * 0.33333334 + fVar276) * fVar211 +
               ((fVar163 - fVar174) * 0.33333334 + fVar254) * fVar100;
  fStack_39c = ((fVar142 - fVar257) * 0.33333334 + fVar279) * fVar211 +
               ((fVar164 - fVar197) * 0.33333334 + fVar226) * fVar100;
  local_3c8 = (fVar297 - (fVar294 - fVar313) * 0.33333334) * fVar211 +
              (fVar143 - (fVar141 - fVar223) * 0.33333334) * fVar100;
  fStack_3c4 = (fVar309 - (fVar296 - fVar318) * 0.33333334) * fVar211 +
               (fVar160 - (fVar71 - fVar251) * 0.33333334) * fVar100;
  fStack_3c0 = (fVar170 - (fVar306 - fVar293) * 0.33333334) * fVar211 +
               (fVar162 - (fVar101 - fVar236) * 0.33333334) * fVar100;
  fStack_3bc = (fVar172 - (fVar308 - fVar295) * 0.33333334) * fVar211 +
               (fVar165 - (fVar102 - fVar312) * 0.33333334) * fVar100;
  local_3b8 = fVar297 * fVar211 + fVar143 * fVar100;
  fStack_3b4 = fVar309 * fVar211 + fVar160 * fVar100;
  fStack_3b0 = fVar170 * fVar211 + fVar162 * fVar100;
  fStack_3ac = fVar172 * fVar211 + fVar165 * fVar100;
  local_388 = fVar212 * fVar211 + fVar198 * fVar100;
  fStack_384 = fVar222 * fVar211 + fVar199 * fVar100;
  fStack_380 = fVar224 * fVar211 + fVar209 * fVar100;
  fStack_37c = fVar225 * fVar211 + fVar210 * fVar100;
  local_378 = ((fVar239 + fVar310) * 0.33333334 + fVar212) * fVar211 +
              ((fVar168 + fVar144) * 0.33333334 + fVar198) * fVar100;
  fStack_374 = ((fVar252 + fVar317) * 0.33333334 + fVar222) * fVar211 +
               ((fVar169 + fVar161) * 0.33333334 + fVar199) * fVar100;
  fStack_370 = ((fVar255 + fVar319) * 0.33333334 + fVar224) * fVar211 +
               ((fVar174 + fVar163) * 0.33333334 + fVar209) * fVar100;
  fStack_36c = ((fVar257 + fVar142) * 0.33333334 + fVar225) * fVar211 +
               ((fVar197 + fVar164) * 0.33333334 + fVar210) * fVar100;
  local_3d8 = (fVar275 - (fVar313 + fVar294) * 0.33333334) * fVar211 +
              (fVar121 - (fVar223 + fVar141) * 0.33333334) * fVar100;
  fStack_3d4 = (fVar282 - (fVar318 + fVar296) * 0.33333334) * fVar211 +
               (fVar122 - (fVar251 + fVar71) * 0.33333334) * fVar100;
  fStack_3d0 = (fVar291 - (fVar293 + fVar306) * 0.33333334) * fVar211 +
               (fVar123 - (fVar236 + fVar101) * 0.33333334) * fVar100;
  fStack_3cc = (fVar292 - (fVar295 + fVar308) * 0.33333334) * fVar211 +
               (fVar140 - (fVar312 + fVar102) * 0.33333334) * fVar100;
  local_2b8 = fVar211 * fVar275 + fVar100 * fVar121;
  fStack_2b4 = fVar211 * fVar282 + fVar100 * fVar122;
  fStack_2b0 = fVar211 * fVar291 + fVar100 * fVar123;
  fStack_2ac = fVar211 * fVar292 + fVar100 * fVar140;
  fVar141 = (ray->org).field_0.m128[0];
  fVar71 = (ray->org).field_0.m128[1];
  fVar100 = (ray->org).field_0.m128[2];
  fVar101 = (pre->ray_space).vx.field_0.m128[0];
  fVar102 = (pre->ray_space).vx.field_0.m128[1];
  fVar121 = (pre->ray_space).vy.field_0.m128[0];
  fVar122 = (pre->ray_space).vy.field_0.m128[1];
  fVar123 = (pre->ray_space).vz.field_0.m128[0];
  fVar140 = (pre->ray_space).vz.field_0.m128[1];
  local_318 = (local_398 - fVar141) * fVar101 +
              (fStack_394 - fVar71) * fVar121 + (fStack_390 - fVar100) * fVar123;
  fStack_314 = (local_398 - fVar141) * fVar102 +
               (fStack_394 - fVar71) * fVar122 + (fStack_390 - fVar100) * fVar140;
  local_208 = CONCAT44(fStack_314,local_318);
  fVar162 = (local_3a8 - fVar141) * fVar101 +
            (fStack_3a4 - fVar71) * fVar121 + (fStack_3a0 - fVar100) * fVar123;
  fVar165 = (local_3a8 - fVar141) * fVar102 +
            (fStack_3a4 - fVar71) * fVar122 + (fStack_3a0 - fVar100) * fVar140;
  local_218 = CONCAT44(fVar165,fVar162);
  fVar143 = (local_3c8 - fVar141) * fVar101 +
            (fStack_3c4 - fVar71) * fVar121 + (fStack_3c0 - fVar100) * fVar123;
  fVar160 = (local_3c8 - fVar141) * fVar102 +
            (fStack_3c4 - fVar71) * fVar122 + (fStack_3c0 - fVar100) * fVar140;
  local_338 = CONCAT44(fVar160,fVar143);
  fVar168 = (local_3b8 - fVar141) * fVar101 +
            (fStack_3b4 - fVar71) * fVar121 + (fStack_3b0 - fVar100) * fVar123;
  fVar169 = (local_3b8 - fVar141) * fVar102 +
            (fStack_3b4 - fVar71) * fVar122 + (fStack_3b0 - fVar100) * fVar140;
  local_238 = CONCAT44(fVar169,fVar168);
  fStack_310 = (local_388 - fVar141) * fVar101 +
               (fStack_384 - fVar71) * fVar121 + (fStack_380 - fVar100) * fVar123;
  fStack_30c = (local_388 - fVar141) * fVar102 +
               (fStack_384 - fVar71) * fVar122 + (fStack_380 - fVar100) * fVar140;
  local_248 = CONCAT44(fStack_30c,fStack_310);
  fVar174 = (local_378 - fVar141) * fVar101 +
            (fStack_374 - fVar71) * fVar121 + (fStack_370 - fVar100) * fVar123;
  fVar197 = (local_378 - fVar141) * fVar102 +
            (fStack_374 - fVar71) * fVar122 + (fStack_370 - fVar100) * fVar140;
  local_258 = CONCAT44(fVar197,fVar174);
  fVar198 = (local_3d8 - fVar141) * fVar101 +
            (fStack_3d4 - fVar71) * fVar121 + (fStack_3d0 - fVar100) * fVar123;
  fVar199 = (local_3d8 - fVar141) * fVar102 +
            (fStack_3d4 - fVar71) * fVar122 + (fStack_3d0 - fVar100) * fVar140;
  uStack_330 = CONCAT44(fVar199,fVar198);
  fVar101 = (local_2b8 - fVar141) * fVar101 +
            (fStack_2b4 - fVar71) * fVar121 + (fStack_2b0 - fVar100) * fVar123;
  fVar71 = (local_2b8 - fVar141) * fVar102 +
           (fStack_2b4 - fVar71) * fVar122 + (fStack_2b0 - fVar100) * fVar140;
  local_278 = CONCAT44(fVar71,fVar101);
  register0x00001308 = local_258;
  local_328 = local_218;
  register0x000012c8 = local_278;
  local_b8 = local_238;
  auVar92._8_4_ = fStack_310;
  auVar92._0_8_ = local_208;
  auVar92._12_4_ = fStack_30c;
  auVar72 = minps(auVar92,_local_328);
  auVar114._8_4_ = fVar198;
  auVar114._0_8_ = local_338;
  auVar114._12_4_ = fVar199;
  auVar125 = minps(auVar114,_local_b8);
  auVar72 = minps(auVar72,auVar125);
  auVar115._4_4_ = fStack_314;
  auVar115._0_4_ = local_318;
  auVar115._8_4_ = fStack_310;
  auVar115._12_4_ = fStack_30c;
  auVar125 = maxps(auVar115,_local_328);
  auVar126._4_4_ = fVar160;
  auVar126._0_4_ = fVar143;
  auVar126._8_4_ = fVar198;
  auVar126._12_4_ = fVar199;
  auVar127 = maxps(auVar126,_local_b8);
  auVar116 = maxps(auVar125,auVar127);
  auVar20._4_8_ = auVar127._8_8_;
  auVar20._0_4_ = auVar72._4_4_;
  auVar128._0_8_ = auVar20._0_8_ << 0x20;
  auVar128._8_4_ = auVar72._8_4_;
  auVar128._12_4_ = auVar72._12_4_;
  auVar129._8_8_ = auVar72._8_8_;
  auVar129._0_8_ = auVar128._8_8_;
  auVar125 = minps(auVar72,auVar129);
  auVar21._4_8_ = auVar72._8_8_;
  auVar21._0_4_ = auVar116._4_4_;
  auVar130._0_8_ = auVar21._0_8_ << 0x20;
  auVar130._8_4_ = auVar116._8_4_;
  auVar130._12_4_ = auVar116._12_4_;
  auVar131._8_8_ = auVar116._8_8_;
  auVar131._0_8_ = auVar130._8_8_;
  auVar72 = maxps(auVar116,auVar131);
  auVar93._0_8_ = auVar125._0_8_ & 0x7fffffff7fffffff;
  auVar93._8_4_ = auVar125._8_4_ & 0x7fffffff;
  auVar93._12_4_ = auVar125._12_4_ & 0x7fffffff;
  auVar117._0_8_ = auVar72._0_8_ & 0x7fffffff7fffffff;
  auVar117._8_4_ = auVar72._8_4_ & 0x7fffffff;
  auVar117._12_4_ = auVar72._12_4_ & 0x7fffffff;
  auVar72 = maxps(auVar93,auVar117);
  fVar141 = auVar72._4_4_;
  if (auVar72._4_4_ <= auVar72._0_4_) {
    fVar141 = auVar72._0_4_;
  }
  local_2f0 = (ulong)uVar65 + 0xf;
  fVar141 = fVar141 * 9.536743e-07;
  local_148 = fVar141;
  fStack_144 = fVar141;
  fStack_140 = fVar141;
  fStack_13c = fVar141;
  local_158 = -fVar141;
  fStack_154 = -fVar141;
  fStack_150 = -fVar141;
  fStack_14c = -fVar141;
  local_88 = fVar162 - local_318;
  fStack_84 = fVar165 - fStack_314;
  fStack_80 = fVar174 - fStack_310;
  fStack_7c = fVar197 - fStack_30c;
  local_98 = fVar143 - fVar162;
  fStack_94 = fVar160 - fVar165;
  fStack_90 = fVar198 - fVar174;
  fStack_8c = fVar199 - fVar197;
  local_a8 = fVar168 - fVar143;
  fStack_a4 = fVar169 - fVar160;
  fStack_a0 = fVar101 - fVar198;
  fStack_9c = fVar71 - fVar199;
  local_188 = local_388 - local_398;
  fStack_184 = fStack_384 - fStack_394;
  fStack_180 = fStack_380 - fStack_390;
  fStack_17c = fStack_37c - fStack_38c;
  local_198 = local_378 - local_3a8;
  fStack_194 = fStack_374 - fStack_3a4;
  fStack_190 = fStack_370 - fStack_3a0;
  fStack_18c = fStack_36c - fStack_39c;
  local_1a8 = local_3d8 - local_3c8;
  fStack_1a4 = fStack_3d4 - fStack_3c4;
  fStack_1a0 = fStack_3d0 - fStack_3c0;
  fStack_19c = fStack_3cc - fStack_3bc;
  local_1b8 = local_2b8 - local_3b8;
  fStack_1b4 = fStack_2b4 - fStack_3b4;
  fStack_1b0 = fStack_2b0 - fStack_3b0;
  fStack_1ac = fStack_2ac - fStack_3ac;
  local_43c = 0;
  uVar55 = 0;
  local_438 = 0x3f80000000000000;
  local_418 = 0x3f80000000000000;
  local_300 = (ulong)uVar66;
  uStack_270 = local_278;
  local_268 = uStack_330;
  uStack_260 = uStack_330;
  uStack_250 = local_258;
  uStack_240 = local_248;
  uStack_230 = local_238;
  local_228 = local_338;
  uStack_220 = local_338;
  uStack_210 = local_218;
  uStack_200 = local_208;
  do {
    fVar71 = 1.0 - (float)local_438;
    fVar100 = 1.0 - (float)local_438;
    fVar101 = 1.0 - local_438._4_4_;
    fVar102 = 1.0 - local_438._4_4_;
    fVar121 = (float)local_208 * fVar71 + (float)local_248 * (float)local_438;
    fVar168 = local_208._4_4_ * fVar100 + local_248._4_4_ * (float)local_438;
    fVar169 = (float)uStack_200 * fVar101 + (float)uStack_240 * local_438._4_4_;
    fVar174 = uStack_200._4_4_ * fVar102 + uStack_240._4_4_ * local_438._4_4_;
    fVar160 = (float)local_218 * fVar71 + (float)local_258 * (float)local_438;
    fVar210 = local_218._4_4_ * fVar100 + local_258._4_4_ * (float)local_438;
    fVar211 = (float)uStack_210 * fVar101 + (float)uStack_250 * local_438._4_4_;
    fVar221 = uStack_210._4_4_ * fVar102 + uStack_250._4_4_ * local_438._4_4_;
    fVar223 = (float)local_228 * fVar71 + (float)local_268 * (float)local_438;
    fVar238 = local_228._4_4_ * fVar100 + local_268._4_4_ * (float)local_438;
    fVar251 = (float)uStack_220 * fVar101 + (float)uStack_260 * local_438._4_4_;
    fVar254 = uStack_220._4_4_ * fVar102 + uStack_260._4_4_ * local_438._4_4_;
    fVar291 = fVar71 * (float)local_238 + (float)local_438 * (float)local_278;
    fVar292 = fVar100 * local_238._4_4_ + (float)local_438 * local_278._4_4_;
    fVar294 = fVar101 * (float)uStack_230 + local_438._4_4_ * (float)uStack_270;
    fVar296 = fVar102 * uStack_230._4_4_ + local_438._4_4_ * uStack_270._4_4_;
    fVar71 = (local_418._4_4_ - (float)local_418) * 0.11111111;
    fVar312 = (local_418._4_4_ - (float)local_418) * 0.0 + (float)local_418;
    fVar226 = (local_418._4_4_ - (float)local_418) * 0.33333334 + (float)local_418;
    fVar236 = (local_418._4_4_ - (float)local_418) * 0.6666667 + (float)local_418;
    fVar237 = (local_418._4_4_ - (float)local_418) * 1.0 + (float)local_418;
    fVar259 = 1.0 - fVar312;
    fVar271 = 1.0 - fVar226;
    fVar275 = 1.0 - fVar236;
    fVar282 = 1.0 - fVar237;
    fVar122 = fVar160 * fVar259 + fVar223 * fVar312;
    fVar123 = fVar160 * fVar271 + fVar223 * fVar226;
    fVar140 = fVar160 * fVar275 + fVar223 * fVar236;
    fVar143 = fVar160 * fVar282 + fVar223 * fVar237;
    fVar197 = fVar210 * fVar259 + fVar238 * fVar312;
    fVar198 = fVar210 * fVar271 + fVar238 * fVar226;
    fVar199 = fVar210 * fVar275 + fVar238 * fVar236;
    fVar209 = fVar210 * fVar282 + fVar238 * fVar237;
    fVar100 = (fVar121 * fVar259 + fVar160 * fVar312) * fVar259 + fVar312 * fVar122;
    fVar101 = (fVar121 * fVar271 + fVar160 * fVar226) * fVar271 + fVar226 * fVar123;
    fVar102 = (fVar121 * fVar275 + fVar160 * fVar236) * fVar275 + fVar236 * fVar140;
    fVar121 = (fVar121 * fVar282 + fVar160 * fVar237) * fVar282 + fVar237 * fVar143;
    fVar160 = (fVar168 * fVar259 + fVar210 * fVar312) * fVar259 + fVar312 * fVar197;
    fVar162 = (fVar168 * fVar271 + fVar210 * fVar226) * fVar271 + fVar226 * fVar198;
    fVar165 = (fVar168 * fVar275 + fVar210 * fVar236) * fVar275 + fVar236 * fVar199;
    fVar168 = (fVar168 * fVar282 + fVar210 * fVar237) * fVar282 + fVar237 * fVar209;
    fVar122 = fVar122 * fVar259 + (fVar223 * fVar259 + fVar291 * fVar312) * fVar312;
    fVar123 = fVar123 * fVar271 + (fVar223 * fVar271 + fVar291 * fVar226) * fVar226;
    fVar140 = fVar140 * fVar275 + (fVar223 * fVar275 + fVar291 * fVar236) * fVar236;
    fVar143 = fVar143 * fVar282 + (fVar223 * fVar282 + fVar291 * fVar237) * fVar237;
    fVar197 = fVar197 * fVar259 + (fVar238 * fVar259 + fVar292 * fVar312) * fVar312;
    fVar198 = fVar198 * fVar271 + (fVar238 * fVar271 + fVar292 * fVar226) * fVar226;
    fVar199 = fVar199 * fVar275 + (fVar238 * fVar275 + fVar292 * fVar236) * fVar236;
    fVar209 = fVar209 * fVar282 + (fVar238 * fVar282 + fVar292 * fVar237) * fVar237;
    local_2a8 = fVar259 * fVar100 + fVar312 * fVar122;
    fStack_2a4 = fVar271 * fVar101 + fVar226 * fVar123;
    fStack_2a0 = fVar275 * fVar102 + fVar236 * fVar140;
    fStack_29c = fVar282 * fVar121 + fVar237 * fVar143;
    local_298 = fVar259 * fVar160 + fVar312 * fVar197;
    fStack_294 = fVar271 * fVar162 + fVar226 * fVar198;
    fStack_290 = fVar275 * fVar165 + fVar236 * fVar199;
    fStack_28c = fVar282 * fVar168 + fVar237 * fVar209;
    fVar123 = (fVar123 - fVar101) * 3.0 * fVar71;
    fVar102 = (fVar140 - fVar102) * 3.0 * fVar71;
    fVar121 = (fVar143 - fVar121) * 3.0 * fVar71;
    fVar140 = (fVar198 - fVar162) * 3.0 * fVar71;
    fVar143 = (fVar199 - fVar165) * 3.0 * fVar71;
    fVar162 = (fVar209 - fVar168) * 3.0 * fVar71;
    local_e8._4_4_ = fStack_2a0;
    local_e8._0_4_ = fStack_2a4;
    local_c8._4_4_ = fStack_290;
    local_c8._0_4_ = fStack_294;
    local_348._0_4_ = local_2a8 + (fVar122 - fVar100) * 3.0 * fVar71;
    local_348._4_4_ = fStack_2a4 + fVar123;
    fStack_340 = fStack_2a0 + fVar102;
    fStack_33c = fStack_29c + fVar121;
    fVar100 = local_298 + (fVar197 - fVar160) * 3.0 * fVar71;
    fVar101 = fStack_294 + fVar140;
    fStack_420 = fStack_290 + fVar143;
    fStack_41c = fStack_28c + fVar162;
    local_288._0_4_ = fStack_2a4 - fVar123;
    local_288._4_4_ = fStack_2a0 - fVar102;
    local_288._8_4_ = fStack_29c - fVar121;
    local_288._12_4_ = 0;
    local_c8._8_4_ = fStack_28c;
    local_c8._12_4_ = 0;
    local_d8._0_4_ = fStack_294 - fVar140;
    local_d8._4_4_ = fStack_290 - fVar143;
    local_d8._8_4_ = fStack_28c - fVar162;
    local_d8._12_4_ = 0;
    fVar102 = fVar211 * fVar259 + fVar251 * fVar312;
    fVar121 = fVar211 * fVar271 + fVar251 * fVar226;
    fVar122 = fVar211 * fVar275 + fVar251 * fVar236;
    fVar123 = fVar211 * fVar282 + fVar251 * fVar237;
    fVar140 = fVar221 * fVar259 + fVar254 * fVar312;
    fVar143 = fVar221 * fVar271 + fVar254 * fVar226;
    fVar160 = fVar221 * fVar275 + fVar254 * fVar236;
    fVar162 = fVar221 * fVar282 + fVar254 * fVar237;
    fVar197 = (fVar169 * fVar259 + fVar211 * fVar312) * fVar259 + fVar312 * fVar102;
    fVar198 = (fVar169 * fVar271 + fVar211 * fVar226) * fVar271 + fVar226 * fVar121;
    fVar199 = (fVar169 * fVar275 + fVar211 * fVar236) * fVar275 + fVar236 * fVar122;
    fVar209 = (fVar169 * fVar282 + fVar211 * fVar237) * fVar282 + fVar237 * fVar123;
    fVar165 = (fVar174 * fVar259 + fVar221 * fVar312) * fVar259 + fVar312 * fVar140;
    fVar168 = (fVar174 * fVar271 + fVar221 * fVar226) * fVar271 + fVar226 * fVar143;
    fVar169 = (fVar174 * fVar275 + fVar221 * fVar236) * fVar275 + fVar236 * fVar160;
    fVar174 = (fVar174 * fVar282 + fVar221 * fVar237) * fVar282 + fVar237 * fVar162;
    fVar102 = fVar102 * fVar259 + (fVar251 * fVar259 + fVar294 * fVar312) * fVar312;
    fVar121 = fVar121 * fVar271 + (fVar251 * fVar271 + fVar294 * fVar226) * fVar226;
    fVar122 = fVar122 * fVar275 + (fVar251 * fVar275 + fVar294 * fVar236) * fVar236;
    fVar123 = fVar123 * fVar282 + (fVar251 * fVar282 + fVar294 * fVar237) * fVar237;
    fVar210 = fVar140 * fVar259 + (fVar254 * fVar259 + fVar296 * fVar312) * fVar312;
    fVar211 = fVar143 * fVar271 + (fVar254 * fVar271 + fVar296 * fVar226) * fVar226;
    fVar221 = fVar160 * fVar275 + (fVar254 * fVar275 + fVar296 * fVar236) * fVar236;
    fVar223 = fVar162 * fVar282 + (fVar254 * fVar282 + fVar296 * fVar237) * fVar237;
    fVar140 = fVar259 * fVar197 + fVar312 * fVar102;
    fVar143 = fVar271 * fVar198 + fVar226 * fVar121;
    fVar160 = fVar275 * fVar199 + fVar236 * fVar122;
    fVar162 = fVar282 * fVar209 + fVar237 * fVar123;
    fVar238 = fVar259 * fVar165 + fVar312 * fVar210;
    fVar251 = fVar271 * fVar168 + fVar226 * fVar211;
    fVar254 = fVar275 * fVar169 + fVar236 * fVar221;
    fVar312 = fVar282 * fVar174 + fVar237 * fVar223;
    fVar121 = (fVar121 - fVar198) * 3.0 * fVar71;
    fVar122 = (fVar122 - fVar199) * 3.0 * fVar71;
    fVar123 = (fVar123 - fVar209) * 3.0 * fVar71;
    fVar168 = (fVar211 - fVar168) * 3.0 * fVar71;
    fVar169 = (fVar221 - fVar169) * 3.0 * fVar71;
    fVar174 = (fVar223 - fVar174) * 3.0 * fVar71;
    local_f8._4_4_ = fVar160;
    local_f8._0_4_ = fVar143;
    local_f8._8_4_ = fVar162;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar254;
    local_118._0_4_ = fVar251;
    local_118._8_4_ = fVar312;
    local_118._12_4_ = 0;
    local_358 = fVar140 + (fVar102 - fVar197) * 3.0 * fVar71;
    fStack_354 = fVar143 + fVar121;
    fStack_350 = fVar160 + fVar122;
    fStack_34c = fVar162 + fVar123;
    local_108 = fVar238 + (fVar210 - fVar165) * 3.0 * fVar71;
    fStack_104 = fVar251 + fVar168;
    fStack_100 = fVar254 + fVar169;
    fStack_fc = fVar312 + fVar174;
    local_138._0_4_ = fVar143 - fVar121;
    local_138._4_4_ = fVar160 - fVar122;
    local_138._8_4_ = fVar162 - fVar123;
    local_138._12_4_ = 0;
    local_128._0_4_ = fVar251 - fVar168;
    local_128._4_4_ = fVar254 - fVar169;
    local_128._8_4_ = fVar312 - fVar174;
    local_128._12_4_ = 0;
    local_e8._8_4_ = fStack_29c;
    local_e8._12_4_ = 0;
    fVar123 = (fVar143 - fStack_2a4) + (fVar140 - local_2a8);
    fVar165 = (fVar160 - fStack_2a0) + (fVar143 - fStack_2a4);
    fVar168 = (fVar162 - fStack_29c) + (fVar160 - fStack_2a0);
    fVar169 = (fVar162 - fStack_29c) + 0.0;
    fVar71 = (fVar251 - fStack_294) + (fVar238 - local_298);
    fVar102 = (fVar254 - fStack_290) + (fVar251 - fStack_294);
    fVar121 = (fVar312 - fStack_28c) + (fVar254 - fStack_290);
    fVar122 = (fVar312 - fStack_28c) + 0.0;
    auVar191._0_8_ =
         CONCAT44(fStack_294 * fVar165 - fStack_2a4 * fVar102,
                  local_298 * fVar123 - local_2a8 * fVar71);
    auVar191._8_4_ = fStack_290 * fVar168 - fStack_2a0 * fVar121;
    auVar191._12_4_ = fStack_28c * fVar169 - fStack_29c * fVar122;
    auVar132._0_4_ = fVar100 * fVar123 - (float)local_348._0_4_ * fVar71;
    auVar132._4_4_ = fVar101 * fVar165 - (float)local_348._4_4_ * fVar102;
    auVar132._8_4_ = fStack_420 * fVar168 - fStack_340 * fVar121;
    auVar132._12_4_ = fStack_41c * fVar169 - fStack_33c * fVar122;
    auVar150._0_8_ =
         CONCAT44(local_d8._4_4_ * fVar165 - fVar102 * local_288._4_4_,
                  local_d8._0_4_ * fVar123 - fVar71 * local_288._0_4_);
    auVar150._8_4_ = local_d8._8_4_ * fVar168 - fVar121 * local_288._8_4_;
    auVar150._12_4_ = fVar169 * 0.0 - fVar122 * 0.0;
    auVar328._0_4_ = fVar123 * fStack_294 - fVar71 * fStack_2a4;
    auVar328._4_4_ = fVar165 * fStack_290 - fVar102 * fStack_2a0;
    auVar328._8_4_ = fVar168 * fStack_28c - fVar121 * fStack_29c;
    auVar328._12_4_ = fVar169 * 0.0 - fVar122 * 0.0;
    auVar94._0_8_ =
         CONCAT44(fVar251 * fVar165 - fVar143 * fVar102,fVar238 * fVar123 - fVar140 * fVar71);
    auVar94._8_4_ = fVar254 * fVar168 - fVar160 * fVar121;
    auVar94._12_4_ = fVar312 * fVar169 - fVar162 * fVar122;
    auVar288._0_4_ = local_108 * fVar123 - local_358 * fVar71;
    auVar288._4_4_ = fStack_104 * fVar165 - fStack_354 * fVar102;
    auVar288._8_4_ = fStack_100 * fVar168 - fStack_350 * fVar121;
    auVar288._12_4_ = fStack_fc * fVar169 - fStack_34c * fVar122;
    auVar227._0_8_ =
         CONCAT44(local_128._4_4_ * fVar165 - fVar102 * local_138._4_4_,
                  local_128._0_4_ * fVar123 - fVar71 * local_138._0_4_);
    auVar227._8_4_ = local_128._8_4_ * fVar168 - fVar121 * local_138._8_4_;
    auVar227._12_4_ = fVar169 * 0.0 - fVar122 * 0.0;
    auVar267._0_4_ = fVar123 * fVar251 - fVar71 * fVar143;
    auVar267._4_4_ = fVar165 * fVar254 - fVar102 * fVar160;
    auVar267._8_4_ = fVar168 * fVar312 - fVar121 * fVar162;
    auVar267._12_4_ = fVar169 * 0.0 - fVar122 * 0.0;
    auVar320._8_4_ = auVar191._8_4_;
    auVar320._0_8_ = auVar191._0_8_;
    auVar320._12_4_ = auVar191._12_4_;
    auVar116 = minps(auVar320,auVar132);
    auVar125 = maxps(auVar191,auVar132);
    auVar133._8_4_ = auVar150._8_4_;
    auVar133._0_8_ = auVar150._0_8_;
    auVar133._12_4_ = auVar150._12_4_;
    auVar72 = minps(auVar133,auVar328);
    auVar321 = minps(auVar116,auVar72);
    auVar72 = maxps(auVar150,auVar328);
    auVar127 = maxps(auVar125,auVar72);
    auVar134._8_4_ = auVar94._8_4_;
    auVar134._0_8_ = auVar94._0_8_;
    auVar134._12_4_ = auVar94._12_4_;
    auVar125 = minps(auVar134,auVar288);
    auVar72 = maxps(auVar94,auVar288);
    auVar151._8_4_ = auVar227._8_4_;
    auVar151._0_8_ = auVar227._0_8_;
    auVar151._12_4_ = auVar227._12_4_;
    auVar116 = minps(auVar151,auVar267);
    auVar125 = minps(auVar125,auVar116);
    auVar116 = minps(auVar321,auVar125);
    auVar125 = maxps(auVar227,auVar267);
    auVar72 = maxps(auVar72,auVar125);
    auVar72 = maxps(auVar127,auVar72);
    bVar64 = auVar116._4_4_ <= fStack_144;
    bVar18 = auVar116._8_4_ <= fStack_140;
    bVar19 = auVar116._12_4_ <= fStack_13c;
    auVar52._4_4_ = -(uint)bVar18;
    auVar52._0_4_ = -(uint)bVar64;
    auVar52._8_4_ = -(uint)bVar19;
    auVar52._12_4_ = 0;
    auVar322 = auVar52 << 0x20;
    auVar192._0_4_ =
         -(uint)(local_158 <= auVar72._0_4_ && auVar116._0_4_ <= local_148) & local_168._0_4_;
    auVar192._4_4_ = -(uint)(fStack_154 <= auVar72._4_4_ && bVar64) & local_168._4_4_;
    auVar192._8_4_ = -(uint)(fStack_150 <= auVar72._8_4_ && bVar18) & local_168._8_4_;
    auVar192._12_4_ = -(uint)(fStack_14c <= auVar72._12_4_ && bVar19) & local_168._12_4_;
    iVar59 = movmskps((int)uVar60,auVar192);
    uVar56 = 0;
    if (iVar59 != 0) {
      fVar123 = (fVar143 - fVar140) + (fStack_2a4 - local_2a8);
      fVar165 = (fVar160 - fVar143) + (fStack_2a0 - fStack_2a4);
      fVar168 = (fVar162 - fVar160) + (fStack_29c - fStack_2a0);
      fVar169 = (0.0 - fVar162) + (0.0 - fStack_29c);
      fVar71 = (fVar251 - fVar238) + (fStack_294 - local_298);
      fVar102 = (fVar254 - fVar251) + (fStack_290 - fStack_294);
      fVar121 = (fVar312 - fVar254) + (fStack_28c - fStack_290);
      fVar122 = (0.0 - fVar312) + (0.0 - fStack_28c);
      auVar329._0_8_ =
           CONCAT44(fStack_294 * fVar165 - fStack_2a4 * fVar102,
                    local_298 * fVar123 - local_2a8 * fVar71);
      auVar329._8_4_ = fStack_290 * fVar168 - fStack_2a0 * fVar121;
      auVar329._12_4_ = fStack_28c * fVar169 - fStack_29c * fVar122;
      auVar135._0_4_ = fVar100 * fVar123 - (float)local_348._0_4_ * fVar71;
      auVar135._4_4_ = fVar101 * fVar165 - (float)local_348._4_4_ * fVar102;
      auVar135._8_4_ = fStack_420 * fVar168 - fStack_340 * fVar121;
      auVar135._12_4_ = fStack_41c * fVar169 - fStack_33c * fVar122;
      auVar322._0_4_ = local_288._0_4_ * fVar71;
      auVar322._4_4_ = local_288._4_4_ * fVar102;
      auVar322._8_4_ = local_288._8_4_ * fVar121;
      auVar322._12_4_ = fVar122 * 0.0;
      auVar218._0_8_ =
           CONCAT44(local_d8._4_4_ * fVar165 - auVar322._4_4_,
                    local_d8._0_4_ * fVar123 - auVar322._0_4_);
      auVar218._8_4_ = local_d8._8_4_ * fVar168 - auVar322._8_4_;
      auVar218._12_4_ = fVar169 * 0.0 - auVar322._12_4_;
      auVar152._0_4_ = fStack_294 * fVar123 - fStack_2a4 * fVar71;
      auVar152._4_4_ = fStack_290 * fVar165 - fStack_2a0 * fVar102;
      auVar152._8_4_ = fStack_28c * fVar168 - fStack_29c * fVar121;
      auVar152._12_4_ = fVar169 * 0.0 - fVar122 * 0.0;
      auVar314._0_8_ =
           CONCAT44(fVar251 * fVar165 - fVar143 * fVar102,fVar238 * fVar123 - fVar140 * fVar71);
      auVar314._8_4_ = fVar254 * fVar168 - fVar160 * fVar121;
      auVar314._12_4_ = fVar312 * fVar169 - fVar162 * fVar122;
      auVar166._0_4_ = local_108 * fVar123 - local_358 * fVar71;
      auVar166._4_4_ = fStack_104 * fVar165 - fStack_354 * fVar102;
      auVar166._8_4_ = fStack_100 * fVar168 - fStack_350 * fVar121;
      auVar166._12_4_ = fStack_fc * fVar169 - fStack_34c * fVar122;
      auVar289._0_8_ =
           CONCAT44(local_128._4_4_ * fVar165 - local_138._4_4_ * fVar102,
                    local_128._0_4_ * fVar123 - local_138._0_4_ * fVar71);
      auVar289._8_4_ = local_128._8_4_ * fVar168 - local_138._8_4_ * fVar121;
      auVar289._12_4_ = fVar169 * 0.0 - fVar122 * 0.0;
      auVar268._0_4_ = fVar123 * fVar251 - fVar71 * fVar143;
      auVar268._4_4_ = fVar165 * fVar254 - fVar102 * fVar160;
      auVar268._8_4_ = fVar168 * fVar312 - fVar121 * fVar162;
      auVar268._12_4_ = fVar169 * 0.0 - fVar122 * 0.0;
      auVar95._8_4_ = auVar329._8_4_;
      auVar95._0_8_ = auVar329._0_8_;
      auVar95._12_4_ = auVar329._12_4_;
      auVar72 = minps(auVar95,auVar135);
      auVar116 = maxps(auVar329,auVar135);
      auVar136._8_4_ = auVar218._8_4_;
      auVar136._0_8_ = auVar218._0_8_;
      auVar136._12_4_ = auVar218._12_4_;
      auVar125 = minps(auVar136,auVar152);
      auVar72 = minps(auVar72,auVar125);
      auVar125 = maxps(auVar218,auVar152);
      auVar321 = maxps(auVar116,auVar125);
      auVar137._8_4_ = auVar314._8_4_;
      auVar137._0_8_ = auVar314._0_8_;
      auVar137._12_4_ = auVar314._12_4_;
      auVar125 = minps(auVar137,auVar166);
      auVar127 = maxps(auVar314,auVar166);
      auVar153._8_4_ = auVar289._8_4_;
      auVar153._0_8_ = auVar289._0_8_;
      auVar153._12_4_ = auVar289._12_4_;
      auVar116 = minps(auVar153,auVar268);
      auVar125 = minps(auVar125,auVar116);
      auVar72 = minps(auVar72,auVar125);
      auVar125 = maxps(auVar289,auVar268);
      auVar125 = maxps(auVar127,auVar125);
      auVar125 = maxps(auVar321,auVar125);
      auVar330._0_4_ =
           -(uint)(local_158 <= auVar125._0_4_ && auVar72._0_4_ <= local_148) & auVar192._0_4_;
      auVar330._4_4_ =
           -(uint)(fStack_154 <= auVar125._4_4_ && auVar72._4_4_ <= fStack_144) & auVar192._4_4_;
      auVar330._8_4_ =
           -(uint)(fStack_150 <= auVar125._8_4_ && auVar72._8_4_ <= fStack_140) & auVar192._8_4_;
      auVar330._12_4_ =
           -(uint)(fStack_14c <= auVar125._12_4_ && auVar72._12_4_ <= fStack_13c) & auVar192._12_4_;
      uVar66 = movmskps(0,auVar330);
      uVar56 = (ulong)uVar66;
    }
    if ((uint)uVar56 != 0) {
      auStack_1f8[uVar55] = (uint)uVar56;
      *(undefined8 *)(afStack_78 + uVar55 * 2) = local_418;
      auStack_58[uVar55] = local_438;
      uVar55 = (ulong)((int)uVar55 + 1);
    }
    do {
      if ((int)uVar55 == 0) {
        if (local_43c != 0) {
          return local_43d;
        }
        fVar141 = ray->tfar;
        auVar120._4_4_ = -(uint)(fStack_174 <= fVar141);
        auVar120._0_4_ = -(uint)(local_178 <= fVar141);
        auVar120._8_4_ = -(uint)(fStack_170 <= fVar141);
        auVar120._12_4_ = -(uint)(fStack_16c <= fVar141);
        uVar66 = movmskps((int)uVar56,auVar120);
        uVar65 = uVar65 & (uint)local_2f0 & uVar66;
        local_43d = uVar65 != 0;
        if (!local_43d) {
          return local_43d;
        }
        goto LAB_00bf1a11;
      }
      uVar68 = (int)uVar55 - 1;
      uVar57 = (ulong)uVar68;
      uVar66 = auStack_1f8[uVar57];
      local_438 = auStack_58[uVar57];
      uVar56 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
        }
      }
      uVar66 = uVar66 - 1 & uVar66;
      auStack_1f8[uVar57] = uVar66;
      if (uVar66 == 0) {
        uVar55 = (ulong)uVar68;
      }
      uVar61 = uVar56 + 1;
      uVar60 = uVar61;
      if ((long)uVar61 < 0) {
        uVar60 = (ulong)((uint)uVar61 & 1) | uVar61 >> 1;
      }
      fVar71 = afStack_78[uVar57 * 2];
      fVar100 = *(float *)((long)auStack_58 + uVar57 * 8 + -0x1c);
      fVar101 = fVar71 * (1.0 - (float)uVar56 * 0.33333334) + fVar100 * (float)uVar56 * 0.33333334;
      fVar102 = fVar71 * (1.0 - (float)uVar61 * 0.33333334) + fVar100 * (float)uVar61 * 0.33333334;
      fVar121 = fVar71 * 0.0 + fVar100 * 0.0;
      fVar100 = fVar71 * 0.0 + fVar100 * 0.0;
      fVar71 = fVar102 - fVar101;
      local_418 = CONCAT44(fVar102,fVar101);
      if (0.16666667 <= fVar71) break;
      fVar165 = (float)local_438;
      fVar169 = (float)((ulong)local_438 >> 0x20);
      fVar122 = 1.0 - fVar165;
      fVar123 = 1.0 - fVar165;
      fVar197 = 1.0 - fVar169;
      fVar198 = 1.0 - fVar169;
      fVar140 = (float)local_208 * fVar122 + (float)local_248 * fVar165;
      fVar143 = local_208._4_4_ * fVar123 + local_248._4_4_ * fVar165;
      fVar160 = (float)uStack_200 * fVar197 + (float)uStack_240 * fVar169;
      fVar162 = uStack_200._4_4_ * fVar198 + uStack_240._4_4_ * fVar169;
      fVar209 = (float)local_218 * fVar122 + (float)local_258 * fVar165;
      fVar210 = local_218._4_4_ * fVar123 + local_258._4_4_ * fVar165;
      fVar221 = (float)uStack_210 * fVar197 + (float)uStack_250 * fVar169;
      fVar223 = uStack_210._4_4_ * fVar198 + uStack_250._4_4_ * fVar169;
      fVar238 = (float)local_228 * fVar122 + (float)local_268 * fVar165;
      fVar254 = local_228._4_4_ * fVar123 + local_268._4_4_ * fVar165;
      fVar226 = (float)uStack_220 * fVar197 + (float)uStack_260 * fVar169;
      fVar237 = uStack_220._4_4_ * fVar198 + uStack_260._4_4_ * fVar169;
      fVar168 = (fVar122 * (float)local_238 + fVar165 * (float)local_278) - fVar238;
      fVar174 = (fVar123 * local_238._4_4_ + fVar165 * local_278._4_4_) - fVar254;
      fVar199 = (fVar197 * (float)uStack_230 + fVar169 * (float)uStack_270) - fVar226;
      fVar211 = (fVar198 * uStack_230._4_4_ + fVar169 * uStack_270._4_4_) - fVar237;
      fVar122 = fVar101 * (fVar238 - fVar209) + fVar209;
      fVar123 = fVar101 * (fVar254 - fVar210) + fVar210;
      fVar197 = fVar101 * (fVar226 - fVar221) + fVar221;
      fVar198 = fVar101 * (fVar237 - fVar223) + fVar223;
      fVar251 = (fVar238 - fVar209) * fVar102 + fVar209;
      fVar312 = (fVar254 - fVar210) * fVar102 + fVar210;
      fVar236 = (fVar226 - fVar221) * fVar102 + fVar221;
      fVar259 = (fVar237 - fVar223) * fVar102 + fVar223;
      fVar271 = fVar101 * (fVar209 - fVar140) + fVar140;
      fVar275 = fVar101 * (fVar210 - fVar143) + fVar143;
      fVar282 = fVar101 * (fVar221 - fVar160) + fVar160;
      fVar291 = fVar101 * (fVar223 - fVar162) + fVar162;
      fVar271 = (fVar122 - fVar271) * fVar101 + fVar271;
      fVar275 = (fVar123 - fVar275) * fVar101 + fVar275;
      fVar282 = (fVar197 - fVar282) * fVar101 + fVar282;
      fVar291 = (fVar198 - fVar291) * fVar101 + fVar291;
      fVar122 = (((fVar101 * fVar168 + fVar238) - fVar122) * fVar101 + fVar122) - fVar271;
      fVar123 = (((fVar101 * fVar174 + fVar254) - fVar123) * fVar101 + fVar123) - fVar275;
      fVar197 = (((fVar101 * fVar199 + fVar226) - fVar197) * fVar101 + fVar197) - fVar282;
      fVar198 = (((fVar101 * fVar211 + fVar237) - fVar198) * fVar101 + fVar198) - fVar291;
      auVar96._0_4_ = fVar101 * fVar122 + fVar271;
      auVar96._4_4_ = fVar101 * fVar123 + fVar275;
      auVar96._8_4_ = fVar101 * fVar197 + fVar282;
      auVar96._12_4_ = fVar101 * fVar198 + fVar291;
      fVar140 = (fVar209 - fVar140) * fVar102 + fVar140;
      fVar143 = (fVar210 - fVar143) * fVar102 + fVar143;
      fVar160 = (fVar221 - fVar160) * fVar102 + fVar160;
      fVar162 = (fVar223 - fVar162) * fVar102 + fVar162;
      fVar140 = (fVar251 - fVar140) * fVar102 + fVar140;
      fVar143 = (fVar312 - fVar143) * fVar102 + fVar143;
      fVar160 = (fVar236 - fVar160) * fVar102 + fVar160;
      fVar162 = (fVar259 - fVar162) * fVar102 + fVar162;
      fVar101 = (((fVar168 * fVar102 + fVar238) - fVar251) * fVar102 + fVar251) - fVar140;
      fVar209 = (((fVar174 * fVar102 + fVar254) - fVar312) * fVar102 + fVar312) - fVar143;
      fVar210 = (((fVar199 * fVar102 + fVar226) - fVar236) * fVar102 + fVar236) - fVar160;
      fVar211 = (((fVar211 * fVar102 + fVar237) - fVar259) * fVar102 + fVar259) - fVar162;
      fVar140 = fVar102 * fVar101 + fVar140;
      fVar143 = fVar102 * fVar209 + fVar143;
      fVar160 = fVar102 * fVar210 + fVar160;
      fVar162 = fVar102 * fVar211 + fVar162;
      fVar102 = fVar71 * 0.33333334;
      fVar168 = fVar122 * 3.0 * fVar102 + auVar96._0_4_;
      fVar174 = fVar123 * 3.0 * fVar102 + auVar96._4_4_;
      fVar197 = fVar197 * 3.0 * fVar102 + auVar96._8_4_;
      fVar198 = fVar198 * 3.0 * fVar102 + auVar96._12_4_;
      fVar199 = fVar140 - fVar102 * fVar101 * 3.0;
      fVar209 = fVar143 - fVar102 * fVar209 * 3.0;
      fVar210 = fVar160 - fVar102 * fVar210 * 3.0;
      fVar211 = fVar162 - fVar102 * fVar211 * 3.0;
      auVar22._4_8_ = auVar322._8_8_;
      auVar22._0_4_ = auVar96._4_4_;
      auVar323._0_8_ = auVar22._0_8_ << 0x20;
      auVar323._8_4_ = auVar96._8_4_;
      auVar323._12_4_ = auVar96._12_4_;
      auVar324._8_8_ = auVar96._8_8_;
      auVar324._0_8_ = auVar323._8_8_;
      fVar251 = (fVar160 - fVar140) + (auVar96._8_4_ - auVar96._0_4_);
      fVar254 = (fVar162 - fVar143) + (auVar96._12_4_ - auVar96._4_4_);
      auVar228._0_4_ = fVar254 * fVar143;
      auVar228._4_4_ = fVar254 * fVar143;
      auVar228._8_4_ = fVar254 * fVar162;
      auVar228._12_4_ = fVar254 * fVar162;
      fVar101 = auVar96._0_4_ * fVar251 + auVar96._4_4_ * fVar254;
      fVar102 = auVar96._8_4_ * fVar251 + auVar96._12_4_ * fVar254;
      fVar312 = fVar168 * fVar251 + fVar174 * fVar254;
      fVar226 = fVar197 * fVar251 + fVar198 * fVar254;
      fVar221 = fVar199 * fVar251 + fVar209 * fVar254;
      auVar245._4_4_ = fVar209 * fVar251 + fVar209 * fVar254;
      auVar245._0_4_ = fVar221;
      fVar223 = fVar210 * fVar251 + fVar211 * fVar254;
      fVar122 = fVar251 * fVar140 + auVar228._0_4_;
      fVar238 = fVar251 * fVar160 + auVar228._8_4_;
      auVar23._4_8_ = auVar228._8_8_;
      auVar23._0_4_ = fVar174 * fVar251 + fVar174 * fVar254;
      auVar229._0_8_ = auVar23._0_8_ << 0x20;
      auVar229._8_4_ = fVar226;
      auVar229._12_4_ = fVar198 * fVar251 + fVar198 * fVar254;
      fVar123 = fVar312;
      if (fVar312 <= fVar101) {
        fVar123 = fVar101;
        fVar101 = fVar312;
      }
      auVar230._8_8_ = auVar229._8_8_;
      auVar230._0_8_ = auVar230._8_8_;
      auVar245._8_4_ = fVar223;
      auVar245._12_4_ = fVar211 * fVar251 + fVar211 * fVar254;
      if (fVar122 <= fVar221) {
        auVar245._0_4_ = fVar122;
      }
      if (auVar245._0_4_ <= fVar101) {
        fVar101 = auVar245._0_4_;
      }
      auVar24._4_8_ = auVar245._8_8_;
      auVar24._0_4_ = fVar251 * fVar143 + auVar228._4_4_;
      auVar246._0_8_ = auVar24._0_8_ << 0x20;
      auVar246._8_4_ = fVar238;
      auVar246._12_4_ = fVar251 * fVar162 + auVar228._12_4_;
      if (fVar122 <= fVar221) {
        fVar122 = fVar221;
      }
      auVar247._8_8_ = auVar246._8_8_;
      auVar247._0_8_ = auVar247._8_8_;
      if (fVar122 <= fVar123) {
        fVar122 = fVar123;
      }
      if (fVar226 <= fVar102) {
        auVar230._0_4_ = fVar102;
        fVar102 = fVar226;
      }
      fVar123 = fVar223;
      if (fVar238 <= fVar223) {
        fVar123 = fVar238;
      }
      if (fVar123 <= fVar102) {
        fVar102 = fVar123;
      }
      if (fVar238 <= fVar223) {
        auVar247._0_4_ = fVar223;
      }
      if (auVar247._0_4_ <= auVar230._0_4_) {
        auVar247._0_4_ = auVar230._0_4_;
      }
      uVar60 = CONCAT71((int7)(uVar60 >> 8),fVar71 < 0.001);
      bVar64 = 3 < (uint)uVar55;
      uVar25 = (undefined3)(uVar68 >> 8);
      uVar56 = (ulong)CONCAT31(uVar25,bVar64);
      fVar123 = auVar247._0_4_;
      if ((0.0001 <= fVar101) || (fVar123 <= -0.0001)) {
        if ((-0.0001 < fVar122 && fVar102 < 0.0001) ||
           ((fVar101 < 0.0001 && -0.0001 < fVar122 || (fVar102 < 0.0001 && -0.0001 < fVar123))))
        goto LAB_00bf3217;
        bVar18 = true;
        auVar322 = auVar324;
      }
      else {
LAB_00bf3217:
        local_418 = CONCAT44(fVar162,fVar160);
        bVar64 = bVar64 || fVar71 < 0.001;
        uVar56 = (ulong)CONCAT31(uVar25,bVar64);
        fVar238 = (float)(~-(uint)(fVar101 < 0.0) & 0x3f800000 | -(uint)(fVar101 < 0.0) & 0xbf800000
                         );
        fVar223 = (float)(~-(uint)(fVar122 < 0.0) & 0x3f800000 | -(uint)(fVar122 < 0.0) & 0xbf800000
                         );
        fVar221 = 0.0;
        if ((fVar238 == fVar223) && (!NAN(fVar238) && !NAN(fVar223))) {
          fVar221 = INFINITY;
        }
        fVar251 = 0.0;
        if ((fVar238 == fVar223) && (!NAN(fVar238) && !NAN(fVar223))) {
          fVar251 = -INFINITY;
        }
        fVar254 = (float)(~-(uint)(fVar102 < 0.0) & 0x3f800000 | -(uint)(fVar102 < 0.0) & 0xbf800000
                         );
        if ((fVar238 != fVar254) || (fVar312 = fVar251, NAN(fVar238) || NAN(fVar254))) {
          if ((fVar102 != fVar101) || (NAN(fVar102) || NAN(fVar101))) {
            fVar102 = -fVar101 / (fVar102 - fVar101);
            fVar102 = (1.0 - fVar102) * 0.0 + fVar102;
            fVar312 = fVar102;
          }
          else {
            fVar102 = INFINITY;
            if ((fVar101 == 0.0) && (fVar102 = INFINITY, !NAN(fVar101))) {
              fVar102 = 0.0;
            }
            fVar312 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar101 == 0.0) & 1) * 4);
          }
          if (fVar102 <= fVar221) {
            fVar221 = fVar102;
          }
          if (fVar312 <= fVar251) {
            fVar312 = fVar251;
          }
        }
        uVar60 = (ulong)(fVar123 < 0.0);
        fVar101 = *(float *)(&DAT_01ff1ecc + uVar60 * 4);
        if ((fVar223 != fVar101) || (fVar102 = fVar312, NAN(fVar223) || NAN(fVar101))) {
          if ((fVar123 != fVar122) || (NAN(fVar123) || NAN(fVar122))) {
            fVar123 = -fVar122 / (fVar123 - fVar122);
            fVar123 = (1.0 - fVar123) * 0.0 + fVar123;
            fVar102 = fVar123;
          }
          else {
            fVar123 = INFINITY;
            if ((fVar122 == 0.0) && (fVar123 = INFINITY, !NAN(fVar122))) {
              fVar123 = 0.0;
            }
            uVar60 = (ulong)(-(uint)(fVar122 == 0.0) & 1);
            fVar102 = *(float *)(&DAT_01ff1ec4 + uVar60 * 4);
          }
          if (fVar123 <= fVar221) {
            fVar221 = fVar123;
          }
          if (fVar102 <= fVar312) {
            fVar102 = fVar312;
          }
        }
        if ((fVar254 != fVar101) || (NAN(fVar254) || NAN(fVar101))) {
          fVar221 = (float)(~-(uint)(fVar221 < 1.0) & 0x3f800000 |
                           (uint)fVar221 & -(uint)(fVar221 < 1.0));
          fVar102 = (float)(~-(uint)(fVar102 < 1.0) & (uint)fVar102 |
                           -(uint)(fVar102 < 1.0) & 0x3f800000);
        }
        fVar122 = SUB164(ZEXT816(0x3f80000000000000),4);
        uVar66 = -(uint)(fVar102 < fVar122);
        fVar221 = (float)(~-(uint)(fVar221 < 0.0) & (uint)fVar221);
        fVar101 = (float)(~uVar66 & 0x3f800000 | (uint)fVar102 & uVar66);
        bVar18 = true;
        auVar322 = ZEXT816(0x3f80000000000000);
        _local_348 = auVar324;
        if (fVar221 <= fVar101) {
          fVar221 = fVar221 + -0.1;
          fVar101 = fVar101 + 0.1;
          uVar66 = -(uint)(fVar101 < fVar122);
          fVar221 = (float)(~-(uint)(fVar221 < 0.0) & (uint)fVar221);
          fVar236 = (float)(~uVar66 & 0x3f800000 | (uint)fVar101 & uVar66);
          fVar251 = 1.0 - fVar221;
          fVar254 = 1.0 - fVar221;
          fVar312 = 1.0 - fVar236;
          fVar226 = 1.0 - fVar236;
          fVar101 = auVar96._0_4_ * fVar251 + auVar96._8_4_ * fVar221;
          fVar102 = auVar96._4_4_ * fVar254 + auVar96._12_4_ * fVar221;
          fVar122 = auVar96._0_4_ * fVar312 + auVar96._8_4_ * fVar236;
          fVar123 = auVar96._4_4_ * fVar226 + auVar96._12_4_ * fVar236;
          fVar223 = fVar168 * fVar251 + fVar197 * fVar221;
          fVar238 = fVar174 * fVar254 + fVar198 * fVar221;
          fVar168 = fVar168 * fVar312 + fVar197 * fVar236;
          fVar174 = fVar174 * fVar226 + fVar198 * fVar236;
          fVar197 = fVar199 * fVar251 + fVar210 * fVar221;
          fVar198 = fVar209 * fVar254 + fVar211 * fVar221;
          fVar199 = fVar199 * fVar312 + fVar210 * fVar236;
          fVar209 = fVar209 * fVar226 + fVar211 * fVar236;
          fVar210 = fVar251 * fVar140 + fVar160 * fVar221;
          fVar211 = fVar254 * fVar143 + fVar162 * fVar221;
          fVar140 = fVar312 * fVar140 + fStack_420 * fVar236;
          fVar143 = fVar226 * fVar143 + fStack_41c * fVar236;
          fVar306 = fVar165 * (1.0 - fVar221) + fVar169 * fVar221;
          fStack_41c = fVar165 * (1.0 - fVar236) + fVar169 * fVar236;
          fVar71 = 1.0 / fVar71;
          auVar118._0_4_ = fVar140 - fVar210;
          auVar118._4_4_ = fVar143 - fVar211;
          auVar118._8_4_ = fVar140 - fVar140;
          auVar118._12_4_ = fVar143 - fVar143;
          auVar154._0_8_ = CONCAT44(fVar209 - fVar198,fVar199 - fVar197);
          auVar154._8_4_ = fVar199 - fVar199;
          auVar154._12_4_ = fVar209 - fVar209;
          auVar269._0_4_ = fVar168 - fVar223;
          auVar269._4_4_ = fVar174 - fVar238;
          auVar269._8_4_ = fVar168 - fVar168;
          auVar269._12_4_ = fVar174 - fVar174;
          auVar219._0_8_ = CONCAT44((fVar238 - fVar102) * 3.0,(fVar223 - fVar101) * 3.0);
          auVar219._8_4_ = (fVar168 - fVar122) * 3.0;
          auVar219._12_4_ = (fVar174 - fVar123) * 3.0;
          auVar193._0_8_ = CONCAT44((fVar198 - fVar238) * 3.0,(fVar197 - fVar223) * 3.0);
          auVar193._8_4_ = (fVar199 - fVar168) * 3.0;
          auVar193._12_4_ = (fVar209 - fVar174) * 3.0;
          auVar248._0_4_ = (fVar210 - fVar197) * 3.0;
          auVar248._4_4_ = (fVar211 - fVar198) * 3.0;
          auVar248._8_4_ = (fVar140 - fVar199) * 3.0;
          auVar248._12_4_ = (fVar143 - fVar209) * 3.0;
          auVar201._8_4_ = auVar193._8_4_;
          auVar201._0_8_ = auVar193._0_8_;
          auVar201._12_4_ = auVar193._12_4_;
          auVar125 = minps(auVar201,auVar248);
          auVar72 = maxps(auVar193,auVar248);
          auVar231._8_4_ = auVar219._8_4_;
          auVar231._0_8_ = auVar219._0_8_;
          auVar231._12_4_ = auVar219._12_4_;
          auVar127 = minps(auVar231,auVar125);
          auVar116 = maxps(auVar219,auVar72);
          auVar26._4_8_ = auVar72._8_8_;
          auVar26._0_4_ = auVar127._4_4_;
          auVar194._0_8_ = auVar26._0_8_ << 0x20;
          auVar194._8_4_ = auVar127._8_4_;
          auVar194._12_4_ = auVar127._12_4_;
          auVar195._8_8_ = auVar127._8_8_;
          auVar195._0_8_ = auVar194._8_8_;
          auVar27._4_8_ = auVar125._8_8_;
          auVar27._0_4_ = auVar116._4_4_;
          auVar202._0_8_ = auVar27._0_8_ << 0x20;
          auVar202._8_4_ = auVar116._8_4_;
          auVar202._12_4_ = auVar116._12_4_;
          auVar203._8_8_ = auVar116._8_8_;
          auVar203._0_8_ = auVar202._8_8_;
          auVar125 = minps(auVar127,auVar195);
          auVar72 = maxps(auVar116,auVar203);
          fVar236 = auVar125._0_4_ * fVar71;
          fVar237 = auVar125._4_4_ * fVar71;
          fVar259 = auVar125._8_4_ * fVar71;
          fVar271 = auVar125._12_4_ * fVar71;
          fVar199 = fVar71 * auVar72._0_4_;
          fVar210 = fVar71 * auVar72._4_4_;
          fVar221 = fVar71 * auVar72._8_4_;
          fVar71 = fVar71 * auVar72._12_4_;
          fVar312 = 1.0 / (fStack_41c - fVar306);
          auVar138._0_8_ = CONCAT44(fVar123 - fVar102,fVar122 - fVar101);
          auVar138._8_4_ = fVar122 - fVar122;
          auVar138._12_4_ = fVar123 - fVar123;
          auVar204._8_4_ = auVar138._8_4_;
          auVar204._0_8_ = auVar138._0_8_;
          auVar204._12_4_ = auVar138._12_4_;
          auVar116 = minps(auVar204,auVar269);
          auVar125 = maxps(auVar138,auVar269);
          auVar97._8_4_ = auVar154._8_4_;
          auVar97._0_8_ = auVar154._0_8_;
          auVar97._12_4_ = auVar154._12_4_;
          auVar72 = minps(auVar97,auVar118);
          auVar116 = minps(auVar116,auVar72);
          auVar72 = maxps(auVar154,auVar118);
          auVar72 = maxps(auVar125,auVar72);
          fVar251 = auVar116._0_4_ * fVar312;
          fVar254 = auVar116._4_4_ * fVar312;
          fVar226 = fVar312 * auVar72._0_4_;
          fVar312 = fVar312 * auVar72._4_4_;
          local_438 = CONCAT44(fStack_41c,fVar306);
          auVar196._4_4_ = fStack_41c;
          auVar196._0_4_ = fVar162;
          auVar196._8_4_ = fVar121;
          auVar196._12_4_ = fVar100;
          fVar101 = (fVar160 + fVar162) * 0.5;
          fVar102 = (fVar306 + fStack_41c) * 0.5;
          fVar122 = (fVar162 + fVar121) * 0.0;
          fVar123 = (fStack_41c + fVar100) * 0.0;
          fVar140 = local_88 * fVar101 + local_318;
          fVar165 = fStack_84 * fVar101 + fStack_314;
          fVar143 = fStack_80 * fVar101 + fStack_310;
          fVar168 = fStack_7c * fVar101 + fStack_30c;
          fVar169 = local_98 * fVar101 + (float)local_328._0_4_;
          fVar174 = fStack_94 * fVar101 + (float)local_328._4_4_;
          fVar197 = fStack_90 * fVar101 + fStack_320;
          fVar198 = fStack_8c * fVar101 + fStack_31c;
          fVar140 = (fVar169 - fVar140) * fVar101 + fVar140;
          fVar165 = (fVar174 - fVar165) * fVar101 + fVar165;
          fVar143 = (fVar197 - fVar143) * fVar101 + fVar143;
          fVar168 = (fVar198 - fVar168) * fVar101 + fVar168;
          fVar169 = (((local_a8 * fVar101 + (float)local_338) - fVar169) * fVar101 + fVar169) -
                    fVar140;
          fVar174 = (((fStack_a4 * fVar101 + local_338._4_4_) - fVar174) * fVar101 + fVar174) -
                    fVar165;
          fVar197 = (((fStack_a0 * fVar101 + (float)uStack_330) - fVar197) * fVar101 + fVar197) -
                    fVar143;
          fVar198 = (((fStack_9c * fVar101 + uStack_330._4_4_) - fVar198) * fVar101 + fVar198) -
                    fVar168;
          fVar140 = fVar101 * fVar169 + fVar140;
          fVar165 = fVar101 * fVar174 + fVar165;
          fVar169 = fVar169 * 3.0;
          fVar174 = fVar174 * 3.0;
          fVar143 = (fVar101 * fVar197 + fVar143) - fVar140;
          fVar168 = (fVar101 * fVar198 + fVar168) - fVar165;
          fVar169 = (fVar197 * 3.0 - fVar169) * fVar102 + fVar169;
          fVar174 = (fVar198 * 3.0 - fVar174) * fVar102 + fVar174;
          auVar119._0_8_ = CONCAT44(fVar169,fVar143) ^ 0x80000000;
          auVar119._8_4_ = fVar169;
          auVar119._12_4_ = fVar169;
          fVar275 = fVar160 - fVar101;
          fVar282 = fVar306 - fVar102;
          fVar291 = fVar162 - fVar122;
          fVar292 = fStack_41c - fVar123;
          fVar294 = fVar162 - fVar101;
          fVar296 = fStack_41c - fVar102;
          fVar121 = fVar121 - fVar122;
          fVar100 = fVar100 - fVar123;
          fVar140 = fVar143 * fVar102 + fVar140;
          fVar165 = fVar168 * fVar102 + fVar165;
          auVar139._0_8_ = CONCAT44(fVar174,fVar168) ^ 0x8000000000000000;
          auVar139._8_4_ = -fVar174;
          auVar139._12_4_ = -fVar174;
          auVar303._0_4_ = fVar168 * fVar169 - fVar174 * fVar143;
          auVar303._4_4_ = auVar303._0_4_;
          auVar303._8_4_ = auVar303._0_4_;
          auVar303._12_4_ = auVar303._0_4_;
          auVar125 = divps(auVar139,auVar303);
          auVar72 = divps(auVar119,auVar303);
          fVar169 = auVar125._0_4_;
          fVar174 = auVar125._4_4_;
          fVar143 = auVar72._0_4_;
          fVar168 = auVar72._4_4_;
          fVar101 = fVar101 - (fVar165 * fVar143 + fVar140 * fVar169);
          fVar122 = fVar102 - (fVar165 * fVar168 + fVar140 * fVar174);
          fVar123 = fVar102 - (fVar165 * auVar72._8_4_ + fVar140 * auVar125._8_4_);
          fVar102 = fVar102 - (fVar165 * auVar72._12_4_ + fVar140 * auVar125._12_4_);
          auVar325._0_8_ = CONCAT44(fVar174 * fVar251,fVar174 * fVar236);
          auVar325._8_4_ = fVar174 * fVar237;
          auVar325._12_4_ = fVar174 * fVar254;
          auVar249._0_4_ = fVar174 * fVar199;
          auVar249._4_4_ = fVar174 * fVar226;
          auVar249._8_4_ = fVar174 * fVar210;
          auVar249._12_4_ = fVar174 * fVar312;
          auVar331._8_4_ = auVar325._8_4_;
          auVar331._0_8_ = auVar325._0_8_;
          auVar331._12_4_ = auVar325._12_4_;
          auVar127 = minps(auVar331,auVar249);
          auVar125 = maxps(auVar249,auVar325);
          auVar155._0_8_ = CONCAT44(fVar168 * fVar254,fVar168 * fVar237);
          auVar155._8_4_ = fVar168 * fVar259;
          auVar155._12_4_ = fVar168 * fVar271;
          auVar326._0_4_ = fVar168 * fVar210;
          auVar326._4_4_ = fVar168 * fVar312;
          auVar326._8_4_ = fVar168 * fVar221;
          auVar326._12_4_ = fVar168 * fVar71;
          auVar232._8_4_ = auVar155._8_4_;
          auVar232._0_8_ = auVar155._0_8_;
          auVar232._12_4_ = auVar155._12_4_;
          auVar72 = minps(auVar232,auVar326);
          auVar116 = maxps(auVar326,auVar155);
          fVar140 = 0.0 - (auVar116._0_4_ + auVar125._0_4_);
          fVar165 = 1.0 - (auVar116._4_4_ + auVar125._4_4_);
          fVar197 = 0.0 - (auVar116._8_4_ + auVar125._8_4_);
          fVar198 = 0.0 - (auVar116._12_4_ + auVar125._12_4_);
          fVar209 = 0.0 - (auVar72._0_4_ + auVar127._0_4_);
          fVar211 = 1.0 - (auVar72._4_4_ + auVar127._4_4_);
          fVar223 = 0.0 - (auVar72._8_4_ + auVar127._8_4_);
          fVar238 = 0.0 - (auVar72._12_4_ + auVar127._12_4_);
          auVar250._0_8_ = CONCAT44(fVar282 * fVar165,fVar275 * fVar140);
          auVar250._8_4_ = fVar291 * fVar197;
          auVar250._12_4_ = fVar292 * fVar198;
          auVar304._0_8_ = CONCAT44(fVar251 * fVar169,fVar236 * fVar169);
          auVar304._8_4_ = fVar237 * fVar169;
          auVar304._12_4_ = fVar254 * fVar169;
          auVar233._0_4_ = fVar169 * fVar199;
          auVar233._4_4_ = fVar169 * fVar226;
          auVar233._8_4_ = fVar169 * fVar210;
          auVar233._12_4_ = fVar169 * fVar312;
          auVar315._8_4_ = auVar304._8_4_;
          auVar315._0_8_ = auVar304._0_8_;
          auVar315._12_4_ = auVar304._12_4_;
          auVar125 = minps(auVar315,auVar233);
          auVar72 = maxps(auVar233,auVar304);
          auVar205._0_8_ = CONCAT44(fVar254 * fVar143,fVar237 * fVar143);
          auVar205._8_4_ = fVar259 * fVar143;
          auVar205._12_4_ = fVar271 * fVar143;
          auVar327._0_4_ = fVar143 * fVar210;
          auVar327._4_4_ = fVar143 * fVar312;
          auVar327._8_4_ = fVar143 * fVar221;
          auVar327._12_4_ = fVar143 * fVar71;
          auVar332._8_4_ = auVar205._8_4_;
          auVar332._0_8_ = auVar205._0_8_;
          auVar332._12_4_ = auVar205._12_4_;
          auVar127 = minps(auVar332,auVar327);
          auVar305._0_4_ = fVar275 * fVar209;
          auVar305._4_4_ = fVar282 * fVar211;
          auVar305._8_4_ = fVar291 * fVar223;
          auVar305._12_4_ = fVar292 * fVar238;
          auVar156._0_8_ = CONCAT44(fVar165 * fVar296,fVar140 * fVar294);
          auVar156._8_4_ = fVar197 * fVar121;
          auVar156._12_4_ = fVar198 * fVar100;
          auVar167._0_4_ = fVar209 * fVar294;
          auVar167._4_4_ = fVar211 * fVar296;
          auVar167._8_4_ = fVar223 * fVar121;
          auVar167._12_4_ = fVar238 * fVar100;
          auVar116 = maxps(auVar327,auVar205);
          auVar322._0_4_ = auVar116._0_4_ + auVar72._0_4_;
          auVar322._4_4_ = auVar116._4_4_ + auVar72._4_4_;
          auVar322._8_4_ = auVar116._8_4_ + auVar72._8_4_;
          auVar322._12_4_ = auVar116._12_4_ + auVar72._12_4_;
          fVar71 = 1.0 - (auVar127._0_4_ + auVar125._0_4_);
          fVar140 = 0.0 - (auVar127._4_4_ + auVar125._4_4_);
          fVar165 = 0.0 - (auVar127._8_4_ + auVar125._8_4_);
          fVar197 = 0.0 - (auVar127._12_4_ + auVar125._12_4_);
          auVar234._0_8_ =
               CONCAT44(fVar282 * (0.0 - auVar322._4_4_),fVar275 * (1.0 - auVar322._0_4_));
          auVar234._8_4_ = fVar291 * (0.0 - auVar322._8_4_);
          auVar234._12_4_ = fVar292 * (0.0 - auVar322._12_4_);
          auVar270._0_4_ = fVar275 * fVar71;
          auVar270._4_4_ = fVar282 * fVar140;
          auVar270._8_4_ = fVar291 * fVar165;
          auVar270._12_4_ = fVar292 * fVar197;
          auVar206._0_8_ =
               CONCAT44((0.0 - auVar322._4_4_) * fVar296,(1.0 - auVar322._0_4_) * fVar294);
          auVar206._8_4_ = (0.0 - auVar322._8_4_) * fVar121;
          auVar206._12_4_ = (0.0 - auVar322._12_4_) * fVar100;
          auVar220._0_4_ = fVar71 * fVar294;
          auVar220._4_4_ = fVar140 * fVar296;
          auVar220._8_4_ = fVar165 * fVar121;
          auVar220._12_4_ = fVar197 * fVar100;
          auVar290._8_4_ = auVar234._8_4_;
          auVar290._0_8_ = auVar234._0_8_;
          auVar290._12_4_ = auVar234._12_4_;
          auVar72 = minps(auVar290,auVar270);
          auVar316._8_4_ = auVar206._8_4_;
          auVar316._0_8_ = auVar206._0_8_;
          auVar316._12_4_ = auVar206._12_4_;
          auVar125 = minps(auVar316,auVar220);
          auVar127 = minps(auVar72,auVar125);
          auVar125 = maxps(auVar270,auVar234);
          auVar72 = maxps(auVar220,auVar206);
          auVar116 = maxps(auVar72,auVar125);
          auVar207._8_4_ = auVar250._8_4_;
          auVar207._0_8_ = auVar250._0_8_;
          auVar207._12_4_ = auVar250._12_4_;
          auVar72 = minps(auVar207,auVar305);
          auVar235._8_4_ = auVar156._8_4_;
          auVar235._0_8_ = auVar156._0_8_;
          auVar235._12_4_ = auVar156._12_4_;
          auVar125 = minps(auVar235,auVar167);
          auVar125 = minps(auVar72,auVar125);
          auVar321 = maxps(auVar305,auVar250);
          auVar72 = maxps(auVar167,auVar156);
          auVar72 = maxps(auVar72,auVar321);
          auVar208._0_4_ = auVar127._4_4_ + auVar127._0_4_ + fVar101;
          auVar208._4_4_ = auVar125._4_4_ + auVar125._0_4_ + fVar122;
          auVar208._8_4_ = auVar127._8_4_ + auVar127._4_4_ + fVar123;
          auVar208._12_4_ = auVar127._12_4_ + auVar125._4_4_ + fVar102;
          fVar71 = auVar116._4_4_ + auVar116._0_4_ + fVar101;
          fVar100 = auVar72._4_4_ + auVar72._0_4_ + fVar122;
          auVar157._4_4_ = fVar100;
          auVar157._0_4_ = fVar71;
          auVar29._4_4_ = fVar306;
          auVar29._0_4_ = fVar160;
          auVar29._8_4_ = fVar162;
          auVar29._12_4_ = fStack_41c;
          auVar125 = maxps(auVar29,auVar208);
          auVar157._8_4_ = auVar116._8_4_ + auVar116._4_4_ + fVar123;
          auVar157._12_4_ = auVar116._12_4_ + auVar72._4_4_ + fVar102;
          auVar72 = minps(auVar157,auVar196);
          iVar59 = -(uint)(auVar72._0_4_ < auVar125._0_4_);
          iVar67 = -(uint)(auVar72._4_4_ < auVar125._4_4_);
          auVar159._4_4_ = iVar67;
          auVar159._0_4_ = iVar59;
          auVar159._8_4_ = iVar67;
          auVar159._12_4_ = iVar67;
          auVar158._8_8_ = auVar159._8_8_;
          auVar158._4_4_ = iVar59;
          auVar158._0_4_ = iVar59;
          uVar66 = movmskpd((int)uVar60,auVar158);
          uVar60 = (ulong)uVar66;
          fStack_420 = fVar162;
          if (uVar66 == 0) {
            uVar60 = 0;
            if (auVar208._0_4_ <= fVar160) {
              auVar322._0_12_ = ZEXT812(0x40400000);
              auVar322._12_4_ = 0.0;
              auVar333._4_4_ = fStack_314;
              auVar333._0_4_ = local_318;
              auVar333._8_4_ = fStack_310;
              auVar333._12_4_ = fStack_30c;
            }
            else {
              auVar322._0_12_ = ZEXT812(0x40400000);
              auVar322._12_4_ = 0.0;
              auVar333._4_4_ = fStack_314;
              auVar333._0_4_ = local_318;
              auVar333._8_4_ = fStack_310;
              auVar333._12_4_ = fStack_30c;
              if (fVar71 < fVar162) {
                iVar59 = -(uint)(fVar100 < fStack_41c);
                uVar60 = (ulong)CONCAT11((char)((uint)iVar59 >> 8),
                                         (byte)iVar59 & fVar306 < auVar208._4_4_);
              }
            }
            bVar53 = bVar64 | (byte)uVar60;
            uVar56 = (ulong)CONCAT31(uVar25,bVar53);
            if (bVar53 == 1) {
              uVar56 = 200;
              do {
                fVar100 = 1.0 - fVar101;
                fVar123 = fVar101 * fVar101 * fVar101;
                fVar160 = auVar322._0_4_;
                fVar121 = fVar101 * fVar101 * fVar160 * fVar100;
                fVar71 = fVar100 * fVar100 * fVar100;
                fVar140 = fVar101 * fVar160 * fVar100 * fVar100;
                fVar100 = fVar71 * auVar333._0_4_ +
                          fVar140 * (float)local_328._0_4_ +
                          fVar121 * (float)local_338 + fVar123 * (float)local_b8._0_4_;
                fVar102 = fVar71 * auVar333._4_4_ +
                          fVar140 * (float)local_328._4_4_ +
                          fVar121 * local_338._4_4_ + fVar123 * (float)local_b8._4_4_;
                fVar100 = ((fVar71 * auVar333._8_4_ +
                           fVar140 * fStack_320 + fVar121 * (float)uStack_330 + fVar123 * fStack_b0)
                          - fVar100) * fVar122 + fVar100;
                fVar102 = ((fVar71 * auVar333._12_4_ +
                           fVar140 * fStack_31c + fVar121 * uStack_330._4_4_ + fVar123 * fStack_ac)
                          - fVar102) * fVar122 + fVar102;
                fVar101 = fVar101 - (fVar102 * fVar143 + fVar100 * fVar169);
                fVar122 = fVar122 - (fVar102 * fVar168 + fVar100 * fVar174);
                fVar71 = ABS(fVar102);
                if (ABS(fVar102) <= ABS(fVar100)) {
                  fVar71 = ABS(fVar100);
                }
                if (fVar71 < fVar141) {
                  if ((((0.0 <= fVar101) && (fVar101 <= 1.0)) && (0.0 <= fVar122)) &&
                     (fVar122 <= 1.0)) {
                    fVar71 = (pre->ray_space).vx.field_0.m128[2];
                    fVar100 = (pre->ray_space).vy.field_0.m128[2];
                    fVar102 = (pre->ray_space).vz.field_0.m128[2];
                    fVar121 = (ray->org).field_0.m128[0];
                    fVar123 = (ray->org).field_0.m128[1];
                    fVar140 = (ray->org).field_0.m128[2];
                    fVar169 = 1.0 - fVar122;
                    fVar168 = 1.0 - fVar101;
                    fVar143 = fVar168 * fVar168 * fVar168;
                    fVar162 = fVar101 * fVar160 * fVar168 * fVar168;
                    fVar165 = fVar101 * fVar101 * fVar101;
                    fVar160 = fVar101 * fVar101 * fVar160 * fVar168;
                    fVar71 = (((fStack_390 - fVar140) * fVar102 +
                              (fStack_394 - fVar123) * fVar100 + (local_398 - fVar121) * fVar71) *
                              fVar169 +
                             ((fStack_380 - fVar140) * fVar102 +
                             (fStack_384 - fVar123) * fVar100 + (local_388 - fVar121) * fVar71) *
                             fVar122) * fVar143 +
                             (((fStack_3a0 - fVar140) * fVar102 +
                              (fStack_3a4 - fVar123) * fVar100 + (local_3a8 - fVar121) * fVar71) *
                              fVar169 +
                             ((fStack_370 - fVar140) * fVar102 +
                             (fStack_374 - fVar123) * fVar100 + (local_378 - fVar121) * fVar71) *
                             fVar122) * fVar162 +
                             (((fStack_3c0 - fVar140) * fVar102 +
                              (fStack_3c4 - fVar123) * fVar100 + (local_3c8 - fVar121) * fVar71) *
                              fVar169 +
                             ((fStack_3d0 - fVar140) * fVar102 +
                             (fStack_3d4 - fVar123) * fVar100 + (local_3d8 - fVar121) * fVar71) *
                             fVar122) * fVar160 +
                             (fVar169 * ((fStack_3b0 - fVar140) * fVar102 +
                                        (fStack_3b4 - fVar123) * fVar100 +
                                        (local_3b8 - fVar121) * fVar71) +
                             ((fStack_2b0 - fVar140) * fVar102 +
                             (fStack_2b4 - fVar123) * fVar100 + (local_2b8 - fVar121) * fVar71) *
                             fVar122) * fVar165;
                    if (((ray->org).field_0.m128[3] <= fVar71) &&
                       (fVar100 = ray->tfar, fVar71 <= fVar100)) {
                      fVar140 = 1.0 - fVar122;
                      fVar169 = 1.0 - fVar122;
                      fVar174 = 1.0 - fVar122;
                      fVar102 = local_3a8 * fVar140 + local_378 * fVar122;
                      fVar121 = fStack_3a4 * fVar169 + fStack_374 * fVar122;
                      fVar123 = fStack_3a0 * fVar174 + fStack_370 * fVar122;
                      fVar197 = local_3c8 * fVar140 + local_3d8 * fVar122;
                      fVar199 = fStack_3c4 * fVar169 + fStack_3d4 * fVar122;
                      fVar210 = fStack_3c0 * fVar174 + fStack_3d0 * fVar122;
                      fVar198 = fVar197 - fVar102;
                      fVar209 = fVar199 - fVar121;
                      fVar211 = fVar210 - fVar123;
                      fVar102 = (((fVar102 - (local_398 * fVar140 + local_388 * fVar122)) * fVar168
                                 + fVar101 * fVar198) * fVar168 +
                                (fVar198 * fVar168 +
                                ((fVar140 * local_3b8 + fVar122 * local_2b8) - fVar197) * fVar101) *
                                fVar101) * 3.0;
                      fVar121 = (((fVar121 - (fStack_394 * fVar169 + fStack_384 * fVar122)) *
                                  fVar168 + fVar101 * fVar209) * fVar168 +
                                (fVar209 * fVar168 +
                                ((fVar169 * fStack_3b4 + fVar122 * fStack_2b4) - fVar199) * fVar101)
                                * fVar101) * 3.0;
                      fVar123 = (((fVar123 - (fStack_390 * fVar174 + fStack_380 * fVar122)) *
                                  fVar168 + fVar101 * fVar211) * fVar168 +
                                (fVar211 * fVar168 +
                                ((fVar174 * fStack_3b0 + fVar122 * fStack_2b0) - fVar210) * fVar101)
                                * fVar101) * 3.0;
                      pGVar12 = (context->scene->geometries).items[local_360].ptr;
                      if ((pGVar12->mask & ray->mask) == 0) {
                        uVar56 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (uVar56 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar140 = fVar143 * local_188 +
                                  fVar162 * local_198 + fVar160 * local_1a8 + fVar165 * local_1b8;
                        fVar168 = fVar143 * fStack_184 +
                                  fVar162 * fStack_194 + fVar160 * fStack_1a4 + fVar165 * fStack_1b4
                        ;
                        fVar143 = fVar143 * fStack_180 +
                                  fVar162 * fStack_190 + fVar160 * fStack_1a0 + fVar165 * fStack_1b0
                        ;
                        local_1e8 = CONCAT44(fVar140 * fVar123 - fVar102 * fVar143,
                                             fVar143 * fVar121 - fVar123 * fVar168);
                        local_1e0 = fVar168 * fVar102 - fVar121 * fVar140;
                        local_1dc = fVar101;
                        fStack_1d8 = fVar122;
                        local_1d4 = (int)local_300;
                        local_1d0 = (int)local_360;
                        local_1cc = context->user->instID[0];
                        local_1c8 = context->user->instPrimID[0];
                        ray->tfar = fVar71;
                        local_3dc = 0xffffffff;
                        local_2e8.valid = &local_3dc;
                        local_2e8.geometryUserPtr = pGVar12->userPtr;
                        local_2e8.context = context->user;
                        local_2e8.hit = (RTCHitN *)&local_1e8;
                        local_2e8.N = 1;
                        local_2e8.ray = (RTCRayN *)ray;
                        if ((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar12->occlusionFilterN)(&local_2e8), *local_2e8.valid != 0)) {
                          p_Var58 = context->args->filter;
                          if (p_Var58 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var58)(&local_2e8);
                            }
                            p_Var58 = (RTCFilterFunctionN)local_2e8.valid;
                            if (*local_2e8.valid == 0) goto LAB_00bf3f1b;
                          }
                          uVar56 = CONCAT71((int7)((ulong)p_Var58 >> 8),1);
                        }
                        else {
LAB_00bf3f1b:
                          uVar56 = 0;
                        }
                        if ((char)uVar56 == '\0') {
                          ray->tfar = fVar100;
                        }
                      }
                      local_43c = (uint)(byte)((byte)local_43c | (byte)uVar56);
                      uVar60 = (ulong)local_43c;
                    }
                  }
                  break;
                }
                uVar56 = uVar56 - 1;
              } while (uVar56 != 0);
            }
            else {
              bVar18 = false;
            }
          }
        }
      }
    } while (bVar18);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }